

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<8,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  int iVar12;
  Geometry *pGVar13;
  __int_type_conflict _Var14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  ulong uVar77;
  RayK<16> *pRVar78;
  byte bVar79;
  ulong uVar80;
  ulong uVar81;
  long lVar82;
  ulong uVar83;
  bool bVar84;
  uint uVar85;
  Geometry *geometry;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  long lVar86;
  float fVar87;
  float fVar132;
  float fVar134;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar93 [16];
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar138;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  float fVar139;
  undefined4 uVar140;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined8 uVar141;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  float fVar153;
  float fVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar161;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar162;
  float fVar163;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  bool local_9f9;
  RTCFilterFunctionNArguments local_9c0;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined4 local_980;
  undefined4 uStack_97c;
  undefined8 uStack_978;
  undefined1 local_970 [16];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  LinearSpace3fa *local_8d0;
  Primitive *local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined8 local_720;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined4 local_700;
  undefined4 uStack_6fc;
  undefined4 uStack_6f8;
  undefined4 uStack_6f4;
  undefined4 uStack_6f0;
  undefined4 uStack_6ec;
  undefined4 uStack_6e8;
  undefined4 uStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined4 local_680;
  int local_67c;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  byte local_630;
  float local_620 [4];
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [64];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar11 = prim[1];
  uVar77 = (ulong)(byte)PVar11;
  lVar24 = uVar77 * 0x25;
  fVar163 = *(float *)(prim + lVar24 + 0x12);
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar91 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar92 = vsubps_avx(auVar88,*(undefined1 (*) [16])(prim + lVar24 + 6));
  fVar153 = fVar163 * auVar92._0_4_;
  fVar139 = fVar163 * auVar91._0_4_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar77 * 4 + 6);
  auVar98 = vpmovsxbd_avx2(auVar88);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar77 * 5 + 6);
  auVar97 = vpmovsxbd_avx2(auVar89);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar77 * 6 + 6);
  auVar109 = vpmovsxbd_avx2(auVar90);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar77 * 0xf + 6);
  auVar108 = vpmovsxbd_avx2(auVar6);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar102 = vpmovsxbd_avx2(auVar200);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar99 = vcvtdq2ps_avx(auVar102);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar77 + 6);
  auVar100 = vpmovsxbd_avx2(auVar7);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar77 * 0x1a + 6);
  auVar107 = vpmovsxbd_avx2(auVar8);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar77 * 0x1b + 6);
  auVar101 = vpmovsxbd_avx2(auVar9);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar77 * 0x1c + 6);
  auVar96 = vpmovsxbd_avx2(auVar10);
  auVar103 = vcvtdq2ps_avx(auVar96);
  auVar173._4_4_ = fVar139;
  auVar173._0_4_ = fVar139;
  auVar173._8_4_ = fVar139;
  auVar173._12_4_ = fVar139;
  auVar173._16_4_ = fVar139;
  auVar173._20_4_ = fVar139;
  auVar173._24_4_ = fVar139;
  auVar173._28_4_ = fVar139;
  auVar192._8_4_ = 1;
  auVar192._0_8_ = 0x100000001;
  auVar192._12_4_ = 1;
  auVar192._16_4_ = 1;
  auVar192._20_4_ = 1;
  auVar192._24_4_ = 1;
  auVar192._28_4_ = 1;
  auVar94 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar105 = ZEXT1632(CONCAT412(fVar163 * auVar91._12_4_,
                                CONCAT48(fVar163 * auVar91._8_4_,
                                         CONCAT44(fVar163 * auVar91._4_4_,fVar139))));
  auVar104 = vpermps_avx2(auVar192,auVar105);
  auVar95 = vpermps_avx512vl(auVar94,auVar105);
  fVar162 = auVar95._0_4_;
  fVar168 = auVar95._4_4_;
  auVar105._4_4_ = fVar168 * auVar109._4_4_;
  auVar105._0_4_ = fVar162 * auVar109._0_4_;
  fVar169 = auVar95._8_4_;
  auVar105._8_4_ = fVar169 * auVar109._8_4_;
  fVar170 = auVar95._12_4_;
  auVar105._12_4_ = fVar170 * auVar109._12_4_;
  fVar154 = auVar95._16_4_;
  auVar105._16_4_ = fVar154 * auVar109._16_4_;
  fVar161 = auVar95._20_4_;
  auVar105._20_4_ = fVar161 * auVar109._20_4_;
  fVar87 = auVar95._24_4_;
  auVar105._24_4_ = fVar87 * auVar109._24_4_;
  auVar105._28_4_ = auVar102._28_4_;
  auVar102._4_4_ = auVar100._4_4_ * fVar168;
  auVar102._0_4_ = auVar100._0_4_ * fVar162;
  auVar102._8_4_ = auVar100._8_4_ * fVar169;
  auVar102._12_4_ = auVar100._12_4_ * fVar170;
  auVar102._16_4_ = auVar100._16_4_ * fVar154;
  auVar102._20_4_ = auVar100._20_4_ * fVar161;
  auVar102._24_4_ = auVar100._24_4_ * fVar87;
  auVar102._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar103._4_4_ * fVar168;
  auVar96._0_4_ = auVar103._0_4_ * fVar162;
  auVar96._8_4_ = auVar103._8_4_ * fVar169;
  auVar96._12_4_ = auVar103._12_4_ * fVar170;
  auVar96._16_4_ = auVar103._16_4_ * fVar154;
  auVar96._20_4_ = auVar103._20_4_ * fVar161;
  auVar96._24_4_ = auVar103._24_4_ * fVar87;
  auVar96._28_4_ = auVar95._28_4_;
  auVar88 = vfmadd231ps_fma(auVar105,auVar104,auVar97);
  auVar89 = vfmadd231ps_fma(auVar102,auVar104,auVar99);
  auVar90 = vfmadd231ps_fma(auVar96,auVar101,auVar104);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar173,auVar98);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar173,auVar108);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar107,auVar173);
  auVar189._4_4_ = fVar153;
  auVar189._0_4_ = fVar153;
  auVar189._8_4_ = fVar153;
  auVar189._12_4_ = fVar153;
  auVar189._16_4_ = fVar153;
  auVar189._20_4_ = fVar153;
  auVar189._24_4_ = fVar153;
  auVar189._28_4_ = fVar153;
  auVar96 = ZEXT1632(CONCAT412(fVar163 * auVar92._12_4_,
                               CONCAT48(fVar163 * auVar92._8_4_,
                                        CONCAT44(fVar163 * auVar92._4_4_,fVar153))));
  auVar102 = vpermps_avx2(auVar192,auVar96);
  auVar96 = vpermps_avx512vl(auVar94,auVar96);
  fVar163 = auVar96._0_4_;
  fVar162 = auVar96._4_4_;
  auVar104._4_4_ = fVar162 * auVar109._4_4_;
  auVar104._0_4_ = fVar163 * auVar109._0_4_;
  fVar168 = auVar96._8_4_;
  auVar104._8_4_ = fVar168 * auVar109._8_4_;
  fVar169 = auVar96._12_4_;
  auVar104._12_4_ = fVar169 * auVar109._12_4_;
  fVar170 = auVar96._16_4_;
  auVar104._16_4_ = fVar170 * auVar109._16_4_;
  fVar154 = auVar96._20_4_;
  auVar104._20_4_ = fVar154 * auVar109._20_4_;
  fVar161 = auVar96._24_4_;
  auVar104._24_4_ = fVar161 * auVar109._24_4_;
  auVar104._28_4_ = fVar139;
  auVar94._4_4_ = auVar100._4_4_ * fVar162;
  auVar94._0_4_ = auVar100._0_4_ * fVar163;
  auVar94._8_4_ = auVar100._8_4_ * fVar168;
  auVar94._12_4_ = auVar100._12_4_ * fVar169;
  auVar94._16_4_ = auVar100._16_4_ * fVar170;
  auVar94._20_4_ = auVar100._20_4_ * fVar154;
  auVar94._24_4_ = auVar100._24_4_ * fVar161;
  auVar94._28_4_ = auVar109._28_4_;
  auVar100._4_4_ = auVar103._4_4_ * fVar162;
  auVar100._0_4_ = auVar103._0_4_ * fVar163;
  auVar100._8_4_ = auVar103._8_4_ * fVar168;
  auVar100._12_4_ = auVar103._12_4_ * fVar169;
  auVar100._16_4_ = auVar103._16_4_ * fVar170;
  auVar100._20_4_ = auVar103._20_4_ * fVar154;
  auVar100._24_4_ = auVar103._24_4_ * fVar161;
  auVar100._28_4_ = auVar96._28_4_;
  auVar6 = vfmadd231ps_fma(auVar104,auVar102,auVar97);
  auVar200 = vfmadd231ps_fma(auVar94,auVar102,auVar99);
  auVar7 = vfmadd231ps_fma(auVar100,auVar102,auVar101);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar189,auVar98);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar200),auVar189,auVar108);
  auVar181._8_4_ = 0x7fffffff;
  auVar181._0_8_ = 0x7fffffff7fffffff;
  auVar181._12_4_ = 0x7fffffff;
  auVar181._16_4_ = 0x7fffffff;
  auVar181._20_4_ = 0x7fffffff;
  auVar181._24_4_ = 0x7fffffff;
  auVar181._28_4_ = 0x7fffffff;
  auVar148 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar189,auVar107);
  auVar98 = vandps_avx(auVar181,ZEXT1632(auVar88));
  auVar177._8_4_ = 0x219392ef;
  auVar177._0_8_ = 0x219392ef219392ef;
  auVar177._12_4_ = 0x219392ef;
  auVar177._16_4_ = 0x219392ef;
  auVar177._20_4_ = 0x219392ef;
  auVar177._24_4_ = 0x219392ef;
  auVar177._28_4_ = 0x219392ef;
  uVar80 = vcmpps_avx512vl(auVar98,auVar177,1);
  bVar84 = (bool)((byte)uVar80 & 1);
  auVar95._0_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar88._0_4_;
  bVar84 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar88._4_4_;
  bVar84 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar88._8_4_;
  bVar84 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar88._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(auVar181,ZEXT1632(auVar89));
  uVar80 = vcmpps_avx512vl(auVar98,auVar177,1);
  bVar84 = (bool)((byte)uVar80 & 1);
  auVar106._0_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar89._0_4_;
  bVar84 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar106._4_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar89._4_4_;
  bVar84 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar106._8_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar89._8_4_;
  bVar84 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar106._12_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar89._12_4_;
  auVar106._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar106._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar106._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar106._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(auVar181,ZEXT1632(auVar90));
  uVar80 = vcmpps_avx512vl(auVar98,auVar177,1);
  bVar84 = (bool)((byte)uVar80 & 1);
  auVar98._0_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar90._0_4_;
  bVar84 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar90._4_4_;
  bVar84 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar90._8_4_;
  bVar84 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar90._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar97 = vrcp14ps_avx512vl(auVar95);
  auVar178._8_4_ = 0x3f800000;
  auVar178._0_8_ = &DAT_3f8000003f800000;
  auVar178._12_4_ = 0x3f800000;
  auVar178._16_4_ = 0x3f800000;
  auVar178._20_4_ = 0x3f800000;
  auVar178._24_4_ = 0x3f800000;
  auVar178._28_4_ = 0x3f800000;
  auVar88 = vfnmadd213ps_fma(auVar95,auVar97,auVar178);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar106);
  auVar89 = vfnmadd213ps_fma(auVar106,auVar97,auVar178);
  auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar98);
  auVar90 = vfnmadd213ps_fma(auVar98,auVar97,auVar178);
  auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar97,auVar97);
  fVar163 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  auVar174._4_4_ = fVar163;
  auVar174._0_4_ = fVar163;
  auVar174._8_4_ = fVar163;
  auVar174._12_4_ = fVar163;
  auVar174._16_4_ = fVar163;
  auVar174._20_4_ = fVar163;
  auVar174._24_4_ = fVar163;
  auVar174._28_4_ = fVar163;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 7 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0xb + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar98);
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 9 + 6));
  auVar6 = vfmadd213ps_fma(auVar97,auVar174,auVar98);
  auVar98 = vcvtdq2ps_avx(auVar109);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0xd + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar98);
  auVar200 = vfmadd213ps_fma(auVar97,auVar174,auVar98);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x12 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar80 = (ulong)(uint)((int)(uVar77 * 5) << 2);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 2 + uVar80 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar98);
  auVar7 = vfmadd213ps_fma(auVar97,auVar174,auVar98);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x18 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar98);
  auVar8 = vfmadd213ps_fma(auVar97,auVar174,auVar98);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x1d + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 + (ulong)(byte)PVar11 * 0x20 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar98);
  auVar9 = vfmadd213ps_fma(auVar97,auVar174,auVar98);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar11 * 0x20 - uVar77) + 6))
  ;
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x23 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar98);
  auVar10 = vfmadd213ps_fma(auVar97,auVar174,auVar98);
  auVar98 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar91));
  auVar107._4_4_ = auVar88._4_4_ * auVar98._4_4_;
  auVar107._0_4_ = auVar88._0_4_ * auVar98._0_4_;
  auVar107._8_4_ = auVar88._8_4_ * auVar98._8_4_;
  auVar107._12_4_ = auVar88._12_4_ * auVar98._12_4_;
  auVar107._16_4_ = auVar98._16_4_ * 0.0;
  auVar107._20_4_ = auVar98._20_4_ * 0.0;
  auVar107._24_4_ = auVar98._24_4_ * 0.0;
  auVar107._28_4_ = auVar98._28_4_;
  auVar98 = vsubps_avx(ZEXT1632(auVar200),ZEXT1632(auVar91));
  auVar152._0_4_ = auVar88._0_4_ * auVar98._0_4_;
  auVar152._4_4_ = auVar88._4_4_ * auVar98._4_4_;
  auVar152._8_4_ = auVar88._8_4_ * auVar98._8_4_;
  auVar152._12_4_ = auVar88._12_4_ * auVar98._12_4_;
  auVar152._16_4_ = auVar98._16_4_ * 0.0;
  auVar152._20_4_ = auVar98._20_4_ * 0.0;
  auVar152._24_4_ = auVar98._24_4_ * 0.0;
  auVar152._28_4_ = 0;
  auVar98 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar92));
  auVar101._4_4_ = auVar89._4_4_ * auVar98._4_4_;
  auVar101._0_4_ = auVar89._0_4_ * auVar98._0_4_;
  auVar101._8_4_ = auVar89._8_4_ * auVar98._8_4_;
  auVar101._12_4_ = auVar89._12_4_ * auVar98._12_4_;
  auVar101._16_4_ = auVar98._16_4_ * 0.0;
  auVar101._20_4_ = auVar98._20_4_ * 0.0;
  auVar101._24_4_ = auVar98._24_4_ * 0.0;
  auVar101._28_4_ = auVar98._28_4_;
  auVar98 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar92));
  auVar149._0_4_ = auVar89._0_4_ * auVar98._0_4_;
  auVar149._4_4_ = auVar89._4_4_ * auVar98._4_4_;
  auVar149._8_4_ = auVar89._8_4_ * auVar98._8_4_;
  auVar149._12_4_ = auVar89._12_4_ * auVar98._12_4_;
  auVar149._16_4_ = auVar98._16_4_ * 0.0;
  auVar149._20_4_ = auVar98._20_4_ * 0.0;
  auVar149._24_4_ = auVar98._24_4_ * 0.0;
  auVar149._28_4_ = 0;
  auVar98 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar148));
  auVar103._4_4_ = auVar90._4_4_ * auVar98._4_4_;
  auVar103._0_4_ = auVar90._0_4_ * auVar98._0_4_;
  auVar103._8_4_ = auVar90._8_4_ * auVar98._8_4_;
  auVar103._12_4_ = auVar90._12_4_ * auVar98._12_4_;
  auVar103._16_4_ = auVar98._16_4_ * 0.0;
  auVar103._20_4_ = auVar98._20_4_ * 0.0;
  auVar103._24_4_ = auVar98._24_4_ * 0.0;
  auVar103._28_4_ = auVar98._28_4_;
  auVar98 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar148));
  auVar120._0_4_ = auVar90._0_4_ * auVar98._0_4_;
  auVar120._4_4_ = auVar90._4_4_ * auVar98._4_4_;
  auVar120._8_4_ = auVar90._8_4_ * auVar98._8_4_;
  auVar120._12_4_ = auVar90._12_4_ * auVar98._12_4_;
  auVar120._16_4_ = auVar98._16_4_ * 0.0;
  auVar120._20_4_ = auVar98._20_4_ * 0.0;
  auVar120._24_4_ = auVar98._24_4_ * 0.0;
  auVar120._28_4_ = 0;
  auVar98 = vpminsd_avx2(auVar107,auVar152);
  auVar97 = vpminsd_avx2(auVar101,auVar149);
  auVar98 = vmaxps_avx(auVar98,auVar97);
  auVar97 = vpminsd_avx2(auVar103,auVar120);
  uVar140 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar109._4_4_ = uVar140;
  auVar109._0_4_ = uVar140;
  auVar109._8_4_ = uVar140;
  auVar109._12_4_ = uVar140;
  auVar109._16_4_ = uVar140;
  auVar109._20_4_ = uVar140;
  auVar109._24_4_ = uVar140;
  auVar109._28_4_ = uVar140;
  auVar97 = vmaxps_avx512vl(auVar97,auVar109);
  auVar98 = vmaxps_avx(auVar98,auVar97);
  auVar97._8_4_ = 0x3f7ffffa;
  auVar97._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar97._12_4_ = 0x3f7ffffa;
  auVar97._16_4_ = 0x3f7ffffa;
  auVar97._20_4_ = 0x3f7ffffa;
  auVar97._24_4_ = 0x3f7ffffa;
  auVar97._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar98,auVar97);
  auVar98 = vpmaxsd_avx2(auVar107,auVar152);
  auVar97 = vpmaxsd_avx2(auVar101,auVar149);
  auVar98 = vminps_avx(auVar98,auVar97);
  auVar97 = vpmaxsd_avx2(auVar103,auVar120);
  uVar140 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar108._4_4_ = uVar140;
  auVar108._0_4_ = uVar140;
  auVar108._8_4_ = uVar140;
  auVar108._12_4_ = uVar140;
  auVar108._16_4_ = uVar140;
  auVar108._20_4_ = uVar140;
  auVar108._24_4_ = uVar140;
  auVar108._28_4_ = uVar140;
  auVar97 = vminps_avx512vl(auVar97,auVar108);
  auVar98 = vminps_avx(auVar98,auVar97);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar99);
  auVar97 = vpbroadcastd_avx512vl();
  uVar23 = vpcmpgtd_avx512vl(auVar97,_DAT_0205a920);
  uVar141 = vcmpps_avx512vl(local_320,auVar98,2);
  local_9f9 = (byte)((byte)uVar141 & (byte)uVar23) != 0;
  if (local_9f9) {
    uVar80 = (ulong)(byte)((byte)uVar141 & (byte)uVar23);
    local_8d0 = pre->ray_space + k;
    auVar147 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar147);
    local_8c8 = prim;
    do {
      lVar24 = 0;
      for (uVar77 = uVar80; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar85 = *(uint *)(local_8c8 + 2);
      pGVar13 = (context->scene->geometries).items[uVar85].ptr;
      local_480._0_8_ = CONCAT44(0,*(uint *)(local_8c8 + lVar24 * 4 + 6));
      uVar77 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                               CONCAT44(0,*(uint *)(local_8c8 + lVar24 * 4 + 6)) *
                               pGVar13[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar163 = (pGVar13->time_range).lower;
      fVar163 = pGVar13->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar163) /
                ((pGVar13->time_range).upper - fVar163));
      auVar88 = vroundss_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),9);
      auVar88 = vminss_avx(auVar88,ZEXT416((uint)(pGVar13->fnumTimeSegments + -1.0)));
      auVar88 = vmaxss_avx(ZEXT816(0) << 0x20,auVar88);
      fVar163 = fVar163 - auVar88._0_4_;
      _Var14 = pGVar13[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar82 = (long)(int)auVar88._0_4_ * 0x38;
      lVar24 = *(long *)(_Var14 + 0x10 + lVar82);
      lVar86 = *(long *)(_Var14 + 0x38 + lVar82);
      lVar15 = *(long *)(_Var14 + 0x48 + lVar82);
      auVar92._4_4_ = fVar163;
      auVar92._0_4_ = fVar163;
      auVar92._8_4_ = fVar163;
      auVar92._12_4_ = fVar163;
      pfVar3 = (float *)(lVar86 + uVar77 * lVar15);
      auVar180._0_4_ = fVar163 * *pfVar3;
      auVar180._4_4_ = fVar163 * pfVar3[1];
      auVar180._8_4_ = fVar163 * pfVar3[2];
      auVar180._12_4_ = fVar163 * pfVar3[3];
      pfVar3 = (float *)(lVar86 + (uVar77 + 1) * lVar15);
      auVar183._0_4_ = fVar163 * *pfVar3;
      auVar183._4_4_ = fVar163 * pfVar3[1];
      auVar183._8_4_ = fVar163 * pfVar3[2];
      auVar183._12_4_ = fVar163 * pfVar3[3];
      auVar88 = vmulps_avx512vl(auVar92,*(undefined1 (*) [16])(lVar86 + (uVar77 + 2) * lVar15));
      auVar89 = vmulps_avx512vl(auVar92,*(undefined1 (*) [16])(lVar86 + lVar15 * (uVar77 + 3)));
      lVar86 = *(long *)(_Var14 + lVar82);
      fVar163 = 1.0 - fVar163;
      auVar91._4_4_ = fVar163;
      auVar91._0_4_ = fVar163;
      auVar91._8_4_ = fVar163;
      auVar91._12_4_ = fVar163;
      local_970 = vfmadd231ps_fma(auVar180,auVar91,*(undefined1 (*) [16])(lVar86 + lVar24 * uVar77))
      ;
      local_750 = vfmadd231ps_fma(auVar183,auVar91,
                                  *(undefined1 (*) [16])(lVar86 + lVar24 * (uVar77 + 1)));
      local_760 = vfmadd231ps_avx512vl
                            (auVar88,auVar91,*(undefined1 (*) [16])(lVar86 + lVar24 * (uVar77 + 2)))
      ;
      local_770 = vfmadd231ps_avx512vl
                            (auVar89,auVar91,*(undefined1 (*) [16])(lVar86 + lVar24 * (uVar77 + 3)))
      ;
      iVar12 = (int)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      lVar24 = (long)iVar12 * 0x44;
      auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar90 = vsubps_avx(local_970,auVar88);
      uVar140 = auVar90._0_4_;
      auVar93._4_4_ = uVar140;
      auVar93._0_4_ = uVar140;
      auVar93._8_4_ = uVar140;
      auVar93._12_4_ = uVar140;
      auVar89 = vshufps_avx(auVar90,auVar90,0x55);
      aVar4 = (local_8d0->vx).field_0;
      aVar5 = (local_8d0->vy).field_0;
      fVar163 = (local_8d0->vz).field_0.m128[0];
      fVar139 = *(float *)((long)&(local_8d0->vz).field_0 + 4);
      fVar162 = *(float *)((long)&(local_8d0->vz).field_0 + 8);
      fVar168 = *(float *)((long)&(local_8d0->vz).field_0 + 0xc);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar185._0_4_ = fVar163 * auVar90._0_4_;
      auVar185._4_4_ = fVar139 * auVar90._4_4_;
      auVar185._8_4_ = fVar162 * auVar90._8_4_;
      auVar185._12_4_ = fVar168 * auVar90._12_4_;
      auVar89 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar5,auVar89);
      auVar6 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar93);
      auVar90 = vsubps_avx(local_750,auVar88);
      uVar140 = auVar90._0_4_;
      auVar150._4_4_ = uVar140;
      auVar150._0_4_ = uVar140;
      auVar150._8_4_ = uVar140;
      auVar150._12_4_ = uVar140;
      auVar89 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar186._0_4_ = fVar163 * auVar90._0_4_;
      auVar186._4_4_ = fVar139 * auVar90._4_4_;
      auVar186._8_4_ = fVar162 * auVar90._8_4_;
      auVar186._12_4_ = fVar168 * auVar90._12_4_;
      auVar89 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar5,auVar89);
      auVar200 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar150);
      auVar90 = vsubps_avx512vl(local_760,auVar88);
      uVar140 = auVar90._0_4_;
      auVar151._4_4_ = uVar140;
      auVar151._0_4_ = uVar140;
      auVar151._8_4_ = uVar140;
      auVar151._12_4_ = uVar140;
      auVar89 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar187._0_4_ = fVar163 * auVar90._0_4_;
      auVar187._4_4_ = fVar139 * auVar90._4_4_;
      auVar187._8_4_ = fVar162 * auVar90._8_4_;
      auVar187._12_4_ = fVar168 * auVar90._12_4_;
      auVar89 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar5,auVar89);
      auVar90 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar151);
      auVar89 = vsubps_avx512vl(local_770,auVar88);
      uVar140 = auVar89._0_4_;
      auVar148._4_4_ = uVar140;
      auVar148._0_4_ = uVar140;
      auVar148._8_4_ = uVar140;
      auVar148._12_4_ = uVar140;
      auVar88 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar191._0_4_ = fVar163 * auVar89._0_4_;
      auVar191._4_4_ = fVar139 * auVar89._4_4_;
      auVar191._8_4_ = fVar162 * auVar89._8_4_;
      auVar191._12_4_ = fVar168 * auVar89._12_4_;
      auVar88 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar5,auVar88);
      auVar7 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar4,auVar148);
      auVar98 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24);
      uVar140 = auVar6._0_4_;
      local_7a0._4_4_ = uVar140;
      local_7a0._0_4_ = uVar140;
      local_7a0._8_4_ = uVar140;
      local_7a0._12_4_ = uVar140;
      local_7a0._16_4_ = uVar140;
      local_7a0._20_4_ = uVar140;
      local_7a0._24_4_ = uVar140;
      local_7a0._28_4_ = uVar140;
      auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x484);
      auVar144._8_4_ = 1;
      auVar144._0_8_ = 0x100000001;
      auVar144._12_4_ = 1;
      auVar144._16_4_ = 1;
      auVar144._20_4_ = 1;
      auVar144._24_4_ = 1;
      auVar144._28_4_ = 1;
      local_740 = vpermps_avx2(auVar144,ZEXT1632(auVar6));
      local_7c0 = vbroadcastss_avx512vl(auVar200);
      local_7e0 = vpermps_avx512vl(auVar144,ZEXT1632(auVar200));
      auVar109 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x908);
      local_920 = vbroadcastss_avx512vl(auVar90);
      local_820 = vpermps_avx512vl(auVar144,ZEXT1632(auVar90));
      auVar108 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0xd8c);
      local_840 = vbroadcastss_avx512vl(auVar7);
      auVar147 = ZEXT3264(local_840);
      local_860 = vpermps_avx512vl(auVar144,ZEXT1632(auVar7));
      auVar203 = ZEXT3264(local_860);
      auVar99 = vmulps_avx512vl(local_840,auVar108);
      auVar100 = vmulps_avx512vl(local_860,auVar108);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar109,local_920);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar109,local_820);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_7c0);
      auVar101 = vfmadd231ps_avx512vl(auVar100,auVar97,local_7e0);
      auVar102 = vfmadd231ps_avx512vl(auVar99,auVar98,local_7a0);
      auVar99 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24);
      auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x484);
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x908);
      auVar96 = vfmadd231ps_avx512vl(auVar101,auVar98,local_740);
      auVar101 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0xd8c);
      auVar103 = vmulps_avx512vl(local_840,auVar101);
      auVar104 = vmulps_avx512vl(local_860,auVar101);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,local_920);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,local_820);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar100,local_7c0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar100,local_7e0);
      auVar8 = vfmadd231ps_fma(auVar103,auVar99,local_7a0);
      auVar9 = vfmadd231ps_fma(auVar104,auVar99,local_740);
      auVar104 = vsubps_avx512vl(ZEXT1632(auVar8),auVar102);
      auVar105 = vsubps_avx512vl(ZEXT1632(auVar9),auVar96);
      auVar103 = vmulps_avx512vl(auVar96,auVar104);
      auVar94 = vmulps_avx512vl(auVar102,auVar105);
      auVar103 = vsubps_avx512vl(auVar103,auVar94);
      auVar88 = vshufps_avx(local_970,local_970,0xff);
      uVar141 = auVar88._0_8_;
      local_340._8_8_ = uVar141;
      local_340._0_8_ = uVar141;
      local_340._16_8_ = uVar141;
      local_340._24_8_ = uVar141;
      auVar88 = vshufps_avx(local_750,local_750,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar88);
      auVar88 = vshufps_avx512vl(local_760,local_760,0xff);
      local_380 = vbroadcastsd_avx512vl(auVar88);
      auVar88 = vshufps_avx512vl(local_770,local_770,0xff);
      uVar141 = auVar88._0_8_;
      register0x00001248 = uVar141;
      local_3a0 = uVar141;
      register0x00001250 = uVar141;
      register0x00001258 = uVar141;
      auVar94 = vmulps_avx512vl(_local_3a0,auVar108);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar109,local_380);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar97,local_360);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar98,local_340);
      auVar95 = vmulps_avx512vl(_local_3a0,auVar101);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar107,local_380);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,local_360);
      auVar10 = vfmadd231ps_fma(auVar95,auVar99,local_340);
      auVar95 = vmulps_avx512vl(auVar105,auVar105);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar104,auVar104);
      auVar106 = vmaxps_avx512vl(auVar94,ZEXT1632(auVar10));
      auVar106 = vmulps_avx512vl(auVar106,auVar106);
      auVar95 = vmulps_avx512vl(auVar106,auVar95);
      auVar103 = vmulps_avx512vl(auVar103,auVar103);
      uVar141 = vcmpps_avx512vl(auVar103,auVar95,2);
      auVar88 = vblendps_avx(auVar6,local_970,8);
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar89 = vandps_avx512vl(auVar88,auVar91);
      auVar88 = vblendps_avx(auVar200,local_750,8);
      auVar88 = vandps_avx512vl(auVar88,auVar91);
      auVar89 = vmaxps_avx(auVar89,auVar88);
      auVar88 = vblendps_avx(auVar90,local_760,8);
      auVar92 = vandps_avx512vl(auVar88,auVar91);
      auVar88 = vblendps_avx(auVar7,local_770,8);
      auVar88 = vandps_avx512vl(auVar88,auVar91);
      auVar88 = vmaxps_avx(auVar92,auVar88);
      auVar88 = vmaxps_avx(auVar89,auVar88);
      auVar89 = vmovshdup_avx(auVar88);
      auVar89 = vmaxss_avx(auVar89,auVar88);
      auVar88 = vshufpd_avx(auVar88,auVar88,1);
      auVar88 = vmaxss_avx(auVar88,auVar89);
      auVar89 = vcvtsi2ss_avx512f(local_760,iVar12);
      local_4c0._0_16_ = auVar89;
      auVar182._0_4_ = auVar89._0_4_;
      auVar182._4_4_ = auVar182._0_4_;
      auVar182._8_4_ = auVar182._0_4_;
      auVar182._12_4_ = auVar182._0_4_;
      auVar182._16_4_ = auVar182._0_4_;
      auVar182._20_4_ = auVar182._0_4_;
      auVar182._24_4_ = auVar182._0_4_;
      auVar182._28_4_ = auVar182._0_4_;
      uVar23 = vcmpps_avx512vl(auVar182,_DAT_02020f40,0xe);
      local_630 = (byte)uVar141 & (byte)uVar23;
      fVar139 = auVar88._0_4_ * 4.7683716e-07;
      auVar159._8_4_ = 2;
      auVar159._0_8_ = 0x200000002;
      auVar159._12_4_ = 2;
      auVar159._16_4_ = 2;
      auVar159._20_4_ = 2;
      auVar159._24_4_ = 2;
      auVar159._28_4_ = 2;
      local_3c0 = vpermps_avx512vl(auVar159,ZEXT1632(auVar6));
      local_3e0 = vpermps_avx512vl(auVar159,ZEXT1632(auVar200));
      local_400 = vpermps_avx512vl(auVar159,ZEXT1632(auVar90));
      auVar103 = vpermps_avx2(auVar159,ZEXT1632(auVar7));
      fVar163 = *(float *)(ray + k * 4 + 0xc0);
      auVar88 = auVar105._0_16_;
      _local_990 = ZEXT416((uint)fVar139);
      if (local_630 == 0) {
        bVar84 = false;
        auVar88 = vxorps_avx512vl(auVar88,auVar88);
        auVar201 = ZEXT1664(auVar88);
        auVar197 = ZEXT3264(local_7a0);
        auVar198 = ZEXT3264(local_740);
        auVar199 = ZEXT3264(local_7c0);
        auVar196 = ZEXT3264(local_7e0);
        auVar204 = ZEXT3264(local_920);
        auVar202 = ZEXT3264(local_820);
      }
      else {
        fStack_87c = 0.0;
        fStack_878 = 0.0;
        fStack_874 = 0.0;
        auVar101 = vmulps_avx512vl(auVar103,auVar101);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_400,auVar101);
        auVar100 = vfmadd213ps_avx512vl(auVar100,local_3e0,auVar107);
        auVar100 = vfmadd213ps_avx512vl(auVar99,local_3c0,auVar100);
        auVar108 = vmulps_avx512vl(auVar103,auVar108);
        auVar109 = vfmadd213ps_avx512vl(auVar109,local_400,auVar108);
        auVar107 = vfmadd213ps_avx512vl(auVar97,local_3e0,auVar109);
        auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1210);
        auVar109 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1694);
        auVar108 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1b18);
        auVar99 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1f9c);
        auVar107 = vfmadd213ps_avx512vl(auVar98,local_3c0,auVar107);
        auVar98 = vmulps_avx512vl(local_840,auVar99);
        auVar101 = vmulps_avx512vl(local_860,auVar99);
        auVar188._0_4_ = auVar103._0_4_ * auVar99._0_4_;
        auVar188._4_4_ = auVar103._4_4_ * auVar99._4_4_;
        auVar188._8_4_ = auVar103._8_4_ * auVar99._8_4_;
        auVar188._12_4_ = auVar103._12_4_ * auVar99._12_4_;
        auVar188._16_4_ = auVar103._16_4_ * auVar99._16_4_;
        auVar188._20_4_ = auVar103._20_4_ * auVar99._20_4_;
        auVar188._24_4_ = auVar103._24_4_ * auVar99._24_4_;
        auVar188._28_4_ = 0;
        auVar204 = ZEXT3264(local_920);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar108,local_920);
        auVar99 = vfmadd231ps_avx512vl(auVar101,auVar108,local_820);
        auVar108 = vfmadd231ps_avx512vl(auVar188,local_400,auVar108);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar109,local_7c0);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar109,local_7e0);
        auVar101 = vfmadd231ps_avx512vl(auVar108,local_3e0,auVar109);
        auVar95 = vfmadd231ps_avx512vl(auVar98,auVar97,local_7a0);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_740);
        auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1210);
        auVar109 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1b18);
        auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1f9c);
        auVar101 = vfmadd231ps_avx512vl(auVar101,local_3c0,auVar97);
        auVar97 = vmulps_avx512vl(local_840,auVar108);
        auVar106 = vmulps_avx512vl(local_860,auVar108);
        auVar34._4_4_ = auVar103._4_4_ * auVar108._4_4_;
        auVar34._0_4_ = auVar103._0_4_ * auVar108._0_4_;
        auVar34._8_4_ = auVar103._8_4_ * auVar108._8_4_;
        auVar34._12_4_ = auVar103._12_4_ * auVar108._12_4_;
        auVar34._16_4_ = auVar103._16_4_ * auVar108._16_4_;
        auVar34._20_4_ = auVar103._20_4_ * auVar108._20_4_;
        auVar34._24_4_ = auVar103._24_4_ * auVar108._24_4_;
        auVar34._28_4_ = auVar108._28_4_;
        auVar108 = vfmadd231ps_avx512vl(auVar97,auVar109,local_920);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar109,local_820);
        auVar109 = vfmadd231ps_avx512vl(auVar34,local_400,auVar109);
        auVar97 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1694);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar97,local_7c0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,local_7e0);
        auVar97 = vfmadd231ps_avx512vl(auVar109,local_3e0,auVar97);
        auVar109 = vfmadd231ps_avx512vl(auVar108,auVar98,local_7a0);
        auVar108 = vfmadd231ps_avx512vl(auVar106,auVar98,local_740);
        auVar106 = vfmadd231ps_avx512vl(auVar97,local_3c0,auVar98);
        auVar193._8_4_ = 0x7fffffff;
        auVar193._0_8_ = 0x7fffffff7fffffff;
        auVar193._12_4_ = 0x7fffffff;
        auVar193._16_4_ = 0x7fffffff;
        auVar193._20_4_ = 0x7fffffff;
        auVar193._24_4_ = 0x7fffffff;
        auVar193._28_4_ = 0x7fffffff;
        auVar98 = vandps_avx(auVar95,auVar193);
        auVar97 = vandps_avx(auVar99,auVar193);
        auVar97 = vmaxps_avx(auVar98,auVar97);
        auVar98 = vandps_avx(auVar101,auVar193);
        auVar98 = vmaxps_avx(auVar97,auVar98);
        auVar101 = vbroadcastss_avx512vl(_local_990);
        uVar77 = vcmpps_avx512vl(auVar98,auVar101,1);
        bVar84 = (bool)((byte)uVar77 & 1);
        auVar110._0_4_ = (float)((uint)bVar84 * auVar104._0_4_ | (uint)!bVar84 * auVar95._0_4_);
        bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar84 * auVar104._4_4_ | (uint)!bVar84 * auVar95._4_4_);
        bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar84 * auVar104._8_4_ | (uint)!bVar84 * auVar95._8_4_);
        bVar84 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar84 * auVar104._12_4_ | (uint)!bVar84 * auVar95._12_4_);
        bVar84 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar84 * auVar104._16_4_ | (uint)!bVar84 * auVar95._16_4_);
        bVar84 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar84 * auVar104._20_4_ | (uint)!bVar84 * auVar95._20_4_);
        bVar84 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar84 * auVar104._24_4_ | (uint)!bVar84 * auVar95._24_4_);
        bVar84 = SUB81(uVar77 >> 7,0);
        auVar110._28_4_ = (uint)bVar84 * auVar104._28_4_ | (uint)!bVar84 * auVar95._28_4_;
        bVar84 = (bool)((byte)uVar77 & 1);
        auVar111._0_4_ = (float)((uint)bVar84 * auVar105._0_4_ | (uint)!bVar84 * auVar99._0_4_);
        bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar84 * auVar105._4_4_ | (uint)!bVar84 * auVar99._4_4_);
        bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar84 * auVar105._8_4_ | (uint)!bVar84 * auVar99._8_4_);
        bVar84 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar84 * auVar105._12_4_ | (uint)!bVar84 * auVar99._12_4_);
        bVar84 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar84 * auVar105._16_4_ | (uint)!bVar84 * auVar99._16_4_);
        bVar84 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar84 * auVar105._20_4_ | (uint)!bVar84 * auVar99._20_4_);
        bVar84 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar84 * auVar105._24_4_ | (uint)!bVar84 * auVar99._24_4_);
        bVar84 = SUB81(uVar77 >> 7,0);
        auVar111._28_4_ = (uint)bVar84 * auVar105._28_4_ | (uint)!bVar84 * auVar99._28_4_;
        auVar98 = vandps_avx(auVar193,auVar109);
        auVar97 = vandps_avx(auVar108,auVar193);
        auVar97 = vmaxps_avx(auVar98,auVar97);
        auVar98 = vandps_avx(auVar106,auVar193);
        auVar98 = vmaxps_avx(auVar97,auVar98);
        uVar77 = vcmpps_avx512vl(auVar98,auVar101,1);
        bVar84 = (bool)((byte)uVar77 & 1);
        auVar112._0_4_ = (float)((uint)bVar84 * auVar104._0_4_ | (uint)!bVar84 * auVar109._0_4_);
        bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar84 * auVar104._4_4_ | (uint)!bVar84 * auVar109._4_4_);
        bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar84 * auVar104._8_4_ | (uint)!bVar84 * auVar109._8_4_);
        bVar84 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar84 * auVar104._12_4_ | (uint)!bVar84 * auVar109._12_4_);
        bVar84 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar84 * auVar104._16_4_ | (uint)!bVar84 * auVar109._16_4_);
        bVar84 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar84 * auVar104._20_4_ | (uint)!bVar84 * auVar109._20_4_);
        bVar84 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar84 * auVar104._24_4_ | (uint)!bVar84 * auVar109._24_4_);
        bVar84 = SUB81(uVar77 >> 7,0);
        auVar112._28_4_ = (uint)bVar84 * auVar104._28_4_ | (uint)!bVar84 * auVar109._28_4_;
        bVar84 = (bool)((byte)uVar77 & 1);
        auVar113._0_4_ = (float)((uint)bVar84 * auVar105._0_4_ | (uint)!bVar84 * auVar108._0_4_);
        bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar84 * auVar105._4_4_ | (uint)!bVar84 * auVar108._4_4_);
        bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar84 * auVar105._8_4_ | (uint)!bVar84 * auVar108._8_4_);
        bVar84 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar84 * auVar105._12_4_ | (uint)!bVar84 * auVar108._12_4_);
        bVar84 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar84 * auVar105._16_4_ | (uint)!bVar84 * auVar108._16_4_);
        bVar84 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar84 * auVar105._20_4_ | (uint)!bVar84 * auVar108._20_4_);
        bVar84 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar84 * auVar105._24_4_ | (uint)!bVar84 * auVar108._24_4_);
        bVar84 = SUB81(uVar77 >> 7,0);
        auVar113._28_4_ = (uint)bVar84 * auVar105._28_4_ | (uint)!bVar84 * auVar108._28_4_;
        auVar93 = vxorps_avx512vl(auVar88,auVar88);
        auVar201 = ZEXT1664(auVar93);
        auVar98 = vfmadd213ps_avx512vl(auVar110,auVar110,ZEXT1632(auVar93));
        auVar88 = vfmadd231ps_fma(auVar98,auVar111,auVar111);
        auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
        fVar162 = auVar98._0_4_;
        fVar168 = auVar98._4_4_;
        fVar169 = auVar98._8_4_;
        fVar170 = auVar98._12_4_;
        fVar154 = auVar98._16_4_;
        fVar161 = auVar98._20_4_;
        fVar87 = auVar98._24_4_;
        auVar35._4_4_ = fVar168 * fVar168 * fVar168 * auVar88._4_4_ * -0.5;
        auVar35._0_4_ = fVar162 * fVar162 * fVar162 * auVar88._0_4_ * -0.5;
        auVar35._8_4_ = fVar169 * fVar169 * fVar169 * auVar88._8_4_ * -0.5;
        auVar35._12_4_ = fVar170 * fVar170 * fVar170 * auVar88._12_4_ * -0.5;
        auVar35._16_4_ = fVar154 * fVar154 * fVar154 * -0.0;
        auVar35._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar35._24_4_ = fVar87 * fVar87 * fVar87 * -0.0;
        auVar35._28_4_ = auVar106._28_4_;
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar98 = vfmadd231ps_avx512vl(auVar35,auVar97,auVar98);
        auVar36._4_4_ = auVar111._4_4_ * auVar98._4_4_;
        auVar36._0_4_ = auVar111._0_4_ * auVar98._0_4_;
        auVar36._8_4_ = auVar111._8_4_ * auVar98._8_4_;
        auVar36._12_4_ = auVar111._12_4_ * auVar98._12_4_;
        auVar36._16_4_ = auVar111._16_4_ * auVar98._16_4_;
        auVar36._20_4_ = auVar111._20_4_ * auVar98._20_4_;
        auVar36._24_4_ = auVar111._24_4_ * auVar98._24_4_;
        auVar36._28_4_ = 0;
        auVar37._4_4_ = auVar98._4_4_ * -auVar110._4_4_;
        auVar37._0_4_ = auVar98._0_4_ * -auVar110._0_4_;
        auVar37._8_4_ = auVar98._8_4_ * -auVar110._8_4_;
        auVar37._12_4_ = auVar98._12_4_ * -auVar110._12_4_;
        auVar37._16_4_ = auVar98._16_4_ * -auVar110._16_4_;
        auVar37._20_4_ = auVar98._20_4_ * -auVar110._20_4_;
        auVar37._24_4_ = auVar98._24_4_ * -auVar110._24_4_;
        auVar37._28_4_ = auVar111._28_4_;
        auVar98 = vmulps_avx512vl(auVar98,ZEXT1632(auVar93));
        auVar104 = ZEXT1632(auVar93);
        auVar109 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar104);
        auVar88 = vfmadd231ps_fma(auVar109,auVar113,auVar113);
        auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
        fVar162 = auVar109._0_4_;
        fVar168 = auVar109._4_4_;
        fVar169 = auVar109._8_4_;
        fVar170 = auVar109._12_4_;
        fVar154 = auVar109._16_4_;
        fVar161 = auVar109._20_4_;
        fVar87 = auVar109._24_4_;
        auVar38._4_4_ = fVar168 * fVar168 * fVar168 * auVar88._4_4_ * -0.5;
        auVar38._0_4_ = fVar162 * fVar162 * fVar162 * auVar88._0_4_ * -0.5;
        auVar38._8_4_ = fVar169 * fVar169 * fVar169 * auVar88._8_4_ * -0.5;
        auVar38._12_4_ = fVar170 * fVar170 * fVar170 * auVar88._12_4_ * -0.5;
        auVar38._16_4_ = fVar154 * fVar154 * fVar154 * -0.0;
        auVar38._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar38._24_4_ = fVar87 * fVar87 * fVar87 * -0.0;
        auVar38._28_4_ = 0;
        auVar97 = vfmadd231ps_avx512vl(auVar38,auVar97,auVar109);
        auVar39._4_4_ = auVar113._4_4_ * auVar97._4_4_;
        auVar39._0_4_ = auVar113._0_4_ * auVar97._0_4_;
        auVar39._8_4_ = auVar113._8_4_ * auVar97._8_4_;
        auVar39._12_4_ = auVar113._12_4_ * auVar97._12_4_;
        auVar39._16_4_ = auVar113._16_4_ * auVar97._16_4_;
        auVar39._20_4_ = auVar113._20_4_ * auVar97._20_4_;
        auVar39._24_4_ = auVar113._24_4_ * auVar97._24_4_;
        auVar39._28_4_ = auVar109._28_4_;
        auVar40._4_4_ = -auVar112._4_4_ * auVar97._4_4_;
        auVar40._0_4_ = -auVar112._0_4_ * auVar97._0_4_;
        auVar40._8_4_ = -auVar112._8_4_ * auVar97._8_4_;
        auVar40._12_4_ = -auVar112._12_4_ * auVar97._12_4_;
        auVar40._16_4_ = -auVar112._16_4_ * auVar97._16_4_;
        auVar40._20_4_ = -auVar112._20_4_ * auVar97._20_4_;
        auVar40._24_4_ = -auVar112._24_4_ * auVar97._24_4_;
        auVar40._28_4_ = auVar112._28_4_ ^ 0x80000000;
        auVar97 = vmulps_avx512vl(auVar97,auVar104);
        auVar88 = vfmadd213ps_fma(auVar36,auVar94,auVar102);
        auVar89 = vfmadd213ps_fma(auVar37,auVar94,auVar96);
        auVar109 = vfmadd213ps_avx512vl(auVar98,auVar94,auVar107);
        auVar108 = vfmadd213ps_avx512vl(auVar39,ZEXT1632(auVar10),ZEXT1632(auVar8));
        auVar91 = vfnmadd213ps_fma(auVar36,auVar94,auVar102);
        auVar101 = ZEXT1632(auVar10);
        auVar90 = vfmadd213ps_fma(auVar40,auVar101,ZEXT1632(auVar9));
        auVar92 = vfnmadd213ps_fma(auVar37,auVar94,auVar96);
        auVar6 = vfmadd213ps_fma(auVar97,auVar101,auVar100);
        auVar99 = vfnmadd231ps_avx512vl(auVar107,auVar94,auVar98);
        auVar8 = vfnmadd213ps_fma(auVar39,auVar101,ZEXT1632(auVar8));
        auVar9 = vfnmadd213ps_fma(auVar40,auVar101,ZEXT1632(auVar9));
        auVar148 = vfnmadd231ps_fma(auVar100,ZEXT1632(auVar10),auVar97);
        auVar97 = vsubps_avx512vl(auVar108,ZEXT1632(auVar91));
        auVar98 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar92));
        auVar100 = vsubps_avx512vl(ZEXT1632(auVar6),auVar99);
        auVar107 = vmulps_avx512vl(auVar98,auVar99);
        auVar200 = vfmsub231ps_fma(auVar107,ZEXT1632(auVar92),auVar100);
        auVar41._4_4_ = auVar91._4_4_ * auVar100._4_4_;
        auVar41._0_4_ = auVar91._0_4_ * auVar100._0_4_;
        auVar41._8_4_ = auVar91._8_4_ * auVar100._8_4_;
        auVar41._12_4_ = auVar91._12_4_ * auVar100._12_4_;
        auVar41._16_4_ = auVar100._16_4_ * 0.0;
        auVar41._20_4_ = auVar100._20_4_ * 0.0;
        auVar41._24_4_ = auVar100._24_4_ * 0.0;
        auVar41._28_4_ = auVar100._28_4_;
        auVar100 = vfmsub231ps_avx512vl(auVar41,auVar99,auVar97);
        auVar42._4_4_ = auVar92._4_4_ * auVar97._4_4_;
        auVar42._0_4_ = auVar92._0_4_ * auVar97._0_4_;
        auVar42._8_4_ = auVar92._8_4_ * auVar97._8_4_;
        auVar42._12_4_ = auVar92._12_4_ * auVar97._12_4_;
        auVar42._16_4_ = auVar97._16_4_ * 0.0;
        auVar42._20_4_ = auVar97._20_4_ * 0.0;
        auVar42._24_4_ = auVar97._24_4_ * 0.0;
        auVar42._28_4_ = auVar97._28_4_;
        auVar7 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar91),auVar98);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar104,auVar100);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar104,ZEXT1632(auVar200));
        auVar105 = ZEXT1632(auVar93);
        uVar77 = vcmpps_avx512vl(auVar98,auVar105,2);
        bVar79 = (byte)uVar77;
        fVar87 = (float)((uint)(bVar79 & 1) * auVar88._0_4_ |
                        (uint)!(bool)(bVar79 & 1) * auVar8._0_4_);
        bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
        fVar132 = (float)((uint)bVar84 * auVar88._4_4_ | (uint)!bVar84 * auVar8._4_4_);
        bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
        fVar134 = (float)((uint)bVar84 * auVar88._8_4_ | (uint)!bVar84 * auVar8._8_4_);
        bVar84 = (bool)((byte)(uVar77 >> 3) & 1);
        fVar136 = (float)((uint)bVar84 * auVar88._12_4_ | (uint)!bVar84 * auVar8._12_4_);
        auVar107 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar134,CONCAT44(fVar132,fVar87))));
        fVar153 = (float)((uint)(bVar79 & 1) * auVar89._0_4_ |
                         (uint)!(bool)(bVar79 & 1) * auVar9._0_4_);
        bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
        fVar133 = (float)((uint)bVar84 * auVar89._4_4_ | (uint)!bVar84 * auVar9._4_4_);
        bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
        fVar135 = (float)((uint)bVar84 * auVar89._8_4_ | (uint)!bVar84 * auVar9._8_4_);
        bVar84 = (bool)((byte)(uVar77 >> 3) & 1);
        fVar137 = (float)((uint)bVar84 * auVar89._12_4_ | (uint)!bVar84 * auVar9._12_4_);
        auVar101 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar153))));
        auVar114._0_4_ =
             (float)((uint)(bVar79 & 1) * auVar109._0_4_ |
                    (uint)!(bool)(bVar79 & 1) * auVar148._0_4_);
        bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar84 * auVar109._4_4_ | (uint)!bVar84 * auVar148._4_4_);
        bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar84 * auVar109._8_4_ | (uint)!bVar84 * auVar148._8_4_);
        bVar84 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar84 * auVar109._12_4_ | (uint)!bVar84 * auVar148._12_4_);
        fVar162 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar109._16_4_);
        auVar114._16_4_ = fVar162;
        fVar168 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar109._20_4_);
        auVar114._20_4_ = fVar168;
        fVar169 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar109._24_4_);
        auVar114._24_4_ = fVar169;
        iVar1 = (uint)(byte)(uVar77 >> 7) * auVar109._28_4_;
        auVar114._28_4_ = iVar1;
        auVar97 = vblendmps_avx512vl(ZEXT1632(auVar91),auVar108);
        auVar115._0_4_ =
             (uint)(bVar79 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar200._0_4_;
        bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar84 * auVar97._4_4_ | (uint)!bVar84 * auVar200._4_4_;
        bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar84 * auVar97._8_4_ | (uint)!bVar84 * auVar200._8_4_;
        bVar84 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar84 * auVar97._12_4_ | (uint)!bVar84 * auVar200._12_4_;
        auVar115._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar97._16_4_;
        auVar115._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar97._20_4_;
        auVar115._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar97._24_4_;
        auVar115._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar97._28_4_;
        auVar97 = vblendmps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar90));
        auVar116._0_4_ =
             (float)((uint)(bVar79 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar89._0_4_)
        ;
        bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar84 * auVar97._4_4_ | (uint)!bVar84 * auVar89._4_4_);
        bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar84 * auVar97._8_4_ | (uint)!bVar84 * auVar89._8_4_);
        bVar84 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar84 * auVar97._12_4_ | (uint)!bVar84 * auVar89._12_4_);
        fVar170 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar97._16_4_);
        auVar116._16_4_ = fVar170;
        fVar154 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar97._20_4_);
        auVar116._20_4_ = fVar154;
        fVar161 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar97._24_4_);
        auVar116._24_4_ = fVar161;
        auVar116._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar97._28_4_;
        auVar97 = vblendmps_avx512vl(auVar99,ZEXT1632(auVar6));
        auVar117._0_4_ =
             (float)((uint)(bVar79 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar109._0_4_
                    );
        bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar84 * auVar97._4_4_ | (uint)!bVar84 * auVar109._4_4_);
        bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar84 * auVar97._8_4_ | (uint)!bVar84 * auVar109._8_4_);
        bVar84 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar84 * auVar97._12_4_ | (uint)!bVar84 * auVar109._12_4_);
        bVar84 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar84 * auVar97._16_4_ | (uint)!bVar84 * auVar109._16_4_);
        bVar84 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar84 * auVar97._20_4_ | (uint)!bVar84 * auVar109._20_4_);
        bVar84 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar84 * auVar97._24_4_ | (uint)!bVar84 * auVar109._24_4_);
        bVar84 = SUB81(uVar77 >> 7,0);
        auVar117._28_4_ = (uint)bVar84 * auVar97._28_4_ | (uint)!bVar84 * auVar109._28_4_;
        auVar118._0_4_ =
             (uint)(bVar79 & 1) * (int)auVar91._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar108._0_4_;
        bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar84 * (int)auVar91._4_4_ | (uint)!bVar84 * auVar108._4_4_;
        bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar84 * (int)auVar91._8_4_ | (uint)!bVar84 * auVar108._8_4_;
        bVar84 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar84 * (int)auVar91._12_4_ | (uint)!bVar84 * auVar108._12_4_;
        auVar118._16_4_ = (uint)!(bool)((byte)(uVar77 >> 4) & 1) * auVar108._16_4_;
        auVar118._20_4_ = (uint)!(bool)((byte)(uVar77 >> 5) & 1) * auVar108._20_4_;
        auVar118._24_4_ = (uint)!(bool)((byte)(uVar77 >> 6) & 1) * auVar108._24_4_;
        auVar118._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar108._28_4_;
        bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar119._0_4_ =
             (uint)(bVar79 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar6._0_4_;
        bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar6._4_4_;
        bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar6._8_4_;
        bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar6._12_4_;
        auVar119._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar99._16_4_;
        auVar119._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar99._20_4_;
        auVar119._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar99._24_4_;
        iVar2 = (uint)(byte)(uVar77 >> 7) * auVar99._28_4_;
        auVar119._28_4_ = iVar2;
        auVar102 = vsubps_avx512vl(auVar118,auVar107);
        auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar92._12_4_ |
                                                (uint)!bVar20 * auVar90._12_4_,
                                                CONCAT48((uint)bVar18 * (int)auVar92._8_4_ |
                                                         (uint)!bVar18 * auVar90._8_4_,
                                                         CONCAT44((uint)bVar84 * (int)auVar92._4_4_
                                                                  | (uint)!bVar84 * auVar90._4_4_,
                                                                  (uint)(bVar79 & 1) *
                                                                  (int)auVar92._0_4_ |
                                                                  (uint)!(bool)(bVar79 & 1) *
                                                                  auVar90._0_4_)))),auVar101);
        auVar109 = vsubps_avx(auVar119,auVar114);
        auVar108 = vsubps_avx(auVar107,auVar115);
        auVar99 = vsubps_avx(auVar101,auVar116);
        auVar100 = vsubps_avx(auVar114,auVar117);
        auVar43._4_4_ = auVar109._4_4_ * fVar132;
        auVar43._0_4_ = auVar109._0_4_ * fVar87;
        auVar43._8_4_ = auVar109._8_4_ * fVar134;
        auVar43._12_4_ = auVar109._12_4_ * fVar136;
        auVar43._16_4_ = auVar109._16_4_ * 0.0;
        auVar43._20_4_ = auVar109._20_4_ * 0.0;
        auVar43._24_4_ = auVar109._24_4_ * 0.0;
        auVar43._28_4_ = iVar2;
        auVar88 = vfmsub231ps_fma(auVar43,auVar114,auVar102);
        auVar44._4_4_ = fVar133 * auVar102._4_4_;
        auVar44._0_4_ = fVar153 * auVar102._0_4_;
        auVar44._8_4_ = fVar135 * auVar102._8_4_;
        auVar44._12_4_ = fVar137 * auVar102._12_4_;
        auVar44._16_4_ = auVar102._16_4_ * 0.0;
        auVar44._20_4_ = auVar102._20_4_ * 0.0;
        auVar44._24_4_ = auVar102._24_4_ * 0.0;
        auVar44._28_4_ = auVar98._28_4_;
        auVar89 = vfmsub231ps_fma(auVar44,auVar107,auVar97);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar105,ZEXT1632(auVar88));
        auVar164._0_4_ = auVar97._0_4_ * auVar114._0_4_;
        auVar164._4_4_ = auVar97._4_4_ * auVar114._4_4_;
        auVar164._8_4_ = auVar97._8_4_ * auVar114._8_4_;
        auVar164._12_4_ = auVar97._12_4_ * auVar114._12_4_;
        auVar164._16_4_ = auVar97._16_4_ * fVar162;
        auVar164._20_4_ = auVar97._20_4_ * fVar168;
        auVar164._24_4_ = auVar97._24_4_ * fVar169;
        auVar164._28_4_ = 0;
        auVar88 = vfmsub231ps_fma(auVar164,auVar101,auVar109);
        auVar96 = vfmadd231ps_avx512vl(auVar98,auVar105,ZEXT1632(auVar88));
        auVar98 = vmulps_avx512vl(auVar100,auVar115);
        auVar98 = vfmsub231ps_avx512vl(auVar98,auVar108,auVar117);
        auVar45._4_4_ = auVar99._4_4_ * auVar117._4_4_;
        auVar45._0_4_ = auVar99._0_4_ * auVar117._0_4_;
        auVar45._8_4_ = auVar99._8_4_ * auVar117._8_4_;
        auVar45._12_4_ = auVar99._12_4_ * auVar117._12_4_;
        auVar45._16_4_ = auVar99._16_4_ * auVar117._16_4_;
        auVar45._20_4_ = auVar99._20_4_ * auVar117._20_4_;
        auVar45._24_4_ = auVar99._24_4_ * auVar117._24_4_;
        auVar45._28_4_ = auVar117._28_4_;
        auVar88 = vfmsub231ps_fma(auVar45,auVar116,auVar100);
        auVar165._0_4_ = auVar116._0_4_ * auVar108._0_4_;
        auVar165._4_4_ = auVar116._4_4_ * auVar108._4_4_;
        auVar165._8_4_ = auVar116._8_4_ * auVar108._8_4_;
        auVar165._12_4_ = auVar116._12_4_ * auVar108._12_4_;
        auVar165._16_4_ = fVar170 * auVar108._16_4_;
        auVar165._20_4_ = fVar154 * auVar108._20_4_;
        auVar165._24_4_ = fVar161 * auVar108._24_4_;
        auVar165._28_4_ = 0;
        auVar89 = vfmsub231ps_fma(auVar165,auVar99,auVar115);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar105,auVar98);
        auVar104 = vfmadd231ps_avx512vl(auVar98,auVar105,ZEXT1632(auVar88));
        auVar98 = vmaxps_avx(auVar96,auVar104);
        uVar141 = vcmpps_avx512vl(auVar98,auVar105,2);
        local_630 = local_630 & (byte)uVar141;
        auVar197 = ZEXT3264(local_7a0);
        auVar198 = ZEXT3264(local_740);
        auVar199 = ZEXT3264(local_7c0);
        auVar196 = ZEXT3264(local_7e0);
        auVar190 = ZEXT1664(_local_990);
        if (local_630 == 0) {
          local_630 = 0;
        }
        else {
          auVar46._4_4_ = auVar100._4_4_ * auVar97._4_4_;
          auVar46._0_4_ = auVar100._0_4_ * auVar97._0_4_;
          auVar46._8_4_ = auVar100._8_4_ * auVar97._8_4_;
          auVar46._12_4_ = auVar100._12_4_ * auVar97._12_4_;
          auVar46._16_4_ = auVar100._16_4_ * auVar97._16_4_;
          auVar46._20_4_ = auVar100._20_4_ * auVar97._20_4_;
          auVar46._24_4_ = auVar100._24_4_ * auVar97._24_4_;
          auVar46._28_4_ = auVar98._28_4_;
          auVar90 = vfmsub231ps_fma(auVar46,auVar99,auVar109);
          auVar47._4_4_ = auVar109._4_4_ * auVar108._4_4_;
          auVar47._0_4_ = auVar109._0_4_ * auVar108._0_4_;
          auVar47._8_4_ = auVar109._8_4_ * auVar108._8_4_;
          auVar47._12_4_ = auVar109._12_4_ * auVar108._12_4_;
          auVar47._16_4_ = auVar109._16_4_ * auVar108._16_4_;
          auVar47._20_4_ = auVar109._20_4_ * auVar108._20_4_;
          auVar47._24_4_ = auVar109._24_4_ * auVar108._24_4_;
          auVar47._28_4_ = auVar109._28_4_;
          auVar89 = vfmsub231ps_fma(auVar47,auVar102,auVar100);
          auVar48._4_4_ = auVar99._4_4_ * auVar102._4_4_;
          auVar48._0_4_ = auVar99._0_4_ * auVar102._0_4_;
          auVar48._8_4_ = auVar99._8_4_ * auVar102._8_4_;
          auVar48._12_4_ = auVar99._12_4_ * auVar102._12_4_;
          auVar48._16_4_ = auVar99._16_4_ * auVar102._16_4_;
          auVar48._20_4_ = auVar99._20_4_ * auVar102._20_4_;
          auVar48._24_4_ = auVar99._24_4_ * auVar102._24_4_;
          auVar48._28_4_ = auVar99._28_4_;
          auVar6 = vfmsub231ps_fma(auVar48,auVar108,auVar97);
          auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar6));
          auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar90),auVar105);
          auVar97 = vrcp14ps_avx512vl(auVar98);
          auVar25._8_4_ = 0x3f800000;
          auVar25._0_8_ = &DAT_3f8000003f800000;
          auVar25._12_4_ = 0x3f800000;
          auVar25._16_4_ = 0x3f800000;
          auVar25._20_4_ = 0x3f800000;
          auVar25._24_4_ = 0x3f800000;
          auVar25._28_4_ = 0x3f800000;
          auVar109 = vfnmadd213ps_avx512vl(auVar97,auVar98,auVar25);
          auVar88 = vfmadd132ps_fma(auVar109,auVar97,auVar97);
          auVar49._4_4_ = auVar6._4_4_ * auVar114._4_4_;
          auVar49._0_4_ = auVar6._0_4_ * auVar114._0_4_;
          auVar49._8_4_ = auVar6._8_4_ * auVar114._8_4_;
          auVar49._12_4_ = auVar6._12_4_ * auVar114._12_4_;
          auVar49._16_4_ = fVar162 * 0.0;
          auVar49._20_4_ = fVar168 * 0.0;
          auVar49._24_4_ = fVar169 * 0.0;
          auVar49._28_4_ = iVar1;
          auVar89 = vfmadd231ps_fma(auVar49,auVar101,ZEXT1632(auVar89));
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar107,ZEXT1632(auVar90));
          fVar162 = auVar88._0_4_;
          fVar168 = auVar88._4_4_;
          fVar169 = auVar88._8_4_;
          fVar170 = auVar88._12_4_;
          auVar97 = ZEXT1632(CONCAT412(auVar89._12_4_ * fVar170,
                                       CONCAT48(auVar89._8_4_ * fVar169,
                                                CONCAT44(auVar89._4_4_ * fVar168,
                                                         auVar89._0_4_ * fVar162))));
          auVar179._4_4_ = fVar163;
          auVar179._0_4_ = fVar163;
          auVar179._8_4_ = fVar163;
          auVar179._12_4_ = fVar163;
          auVar179._16_4_ = fVar163;
          auVar179._20_4_ = fVar163;
          auVar179._24_4_ = fVar163;
          auVar179._28_4_ = fVar163;
          uVar141 = vcmpps_avx512vl(auVar179,auVar97,2);
          uVar140 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar26._4_4_ = uVar140;
          auVar26._0_4_ = uVar140;
          auVar26._8_4_ = uVar140;
          auVar26._12_4_ = uVar140;
          auVar26._16_4_ = uVar140;
          auVar26._20_4_ = uVar140;
          auVar26._24_4_ = uVar140;
          auVar26._28_4_ = uVar140;
          uVar23 = vcmpps_avx512vl(auVar97,auVar26,2);
          local_630 = (byte)uVar141 & (byte)uVar23 & local_630;
          if (local_630 != 0) {
            uVar141 = vcmpps_avx512vl(auVar98,auVar105,4);
            if ((local_630 & (byte)uVar141) != 0) {
              local_630 = local_630 & (byte)uVar141;
              fVar154 = auVar96._0_4_ * fVar162;
              fVar161 = auVar96._4_4_ * fVar168;
              auVar50._4_4_ = fVar161;
              auVar50._0_4_ = fVar154;
              fVar87 = auVar96._8_4_ * fVar169;
              auVar50._8_4_ = fVar87;
              fVar153 = auVar96._12_4_ * fVar170;
              auVar50._12_4_ = fVar153;
              fVar132 = auVar96._16_4_ * 0.0;
              auVar50._16_4_ = fVar132;
              fVar133 = auVar96._20_4_ * 0.0;
              auVar50._20_4_ = fVar133;
              fVar134 = auVar96._24_4_ * 0.0;
              auVar50._24_4_ = fVar134;
              auVar50._28_4_ = auVar96._28_4_;
              fVar162 = auVar104._0_4_ * fVar162;
              fVar168 = auVar104._4_4_ * fVar168;
              auVar51._4_4_ = fVar168;
              auVar51._0_4_ = fVar162;
              fVar169 = auVar104._8_4_ * fVar169;
              auVar51._8_4_ = fVar169;
              fVar170 = auVar104._12_4_ * fVar170;
              auVar51._12_4_ = fVar170;
              fVar135 = auVar104._16_4_ * 0.0;
              auVar51._16_4_ = fVar135;
              fVar136 = auVar104._20_4_ * 0.0;
              auVar51._20_4_ = fVar136;
              fVar137 = auVar104._24_4_ * 0.0;
              auVar51._24_4_ = fVar137;
              auVar51._28_4_ = auVar104._28_4_;
              auVar175._8_4_ = 0x3f800000;
              auVar175._0_8_ = &DAT_3f8000003f800000;
              auVar175._12_4_ = 0x3f800000;
              auVar175._16_4_ = 0x3f800000;
              auVar175._20_4_ = 0x3f800000;
              auVar175._24_4_ = 0x3f800000;
              auVar175._28_4_ = 0x3f800000;
              auVar98 = vsubps_avx(auVar175,auVar50);
              local_940._0_4_ =
                   (uint)(bVar79 & 1) * (int)fVar154 | (uint)!(bool)(bVar79 & 1) * auVar98._0_4_;
              bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
              local_940._4_4_ = (uint)bVar84 * (int)fVar161 | (uint)!bVar84 * auVar98._4_4_;
              bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
              local_940._8_4_ = (uint)bVar84 * (int)fVar87 | (uint)!bVar84 * auVar98._8_4_;
              bVar84 = (bool)((byte)(uVar77 >> 3) & 1);
              local_940._12_4_ = (uint)bVar84 * (int)fVar153 | (uint)!bVar84 * auVar98._12_4_;
              bVar84 = (bool)((byte)(uVar77 >> 4) & 1);
              local_940._16_4_ = (uint)bVar84 * (int)fVar132 | (uint)!bVar84 * auVar98._16_4_;
              bVar84 = (bool)((byte)(uVar77 >> 5) & 1);
              local_940._20_4_ = (uint)bVar84 * (int)fVar133 | (uint)!bVar84 * auVar98._20_4_;
              bVar84 = (bool)((byte)(uVar77 >> 6) & 1);
              local_940._24_4_ = (uint)bVar84 * (int)fVar134 | (uint)!bVar84 * auVar98._24_4_;
              bVar84 = SUB81(uVar77 >> 7,0);
              local_940._28_4_ = (uint)bVar84 * auVar96._28_4_ | (uint)!bVar84 * auVar98._28_4_;
              auVar98 = vsubps_avx(auVar175,auVar51);
              local_560._0_4_ =
                   (uint)(bVar79 & 1) * (int)fVar162 | (uint)!(bool)(bVar79 & 1) * auVar98._0_4_;
              bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
              local_560._4_4_ = (uint)bVar84 * (int)fVar168 | (uint)!bVar84 * auVar98._4_4_;
              bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
              local_560._8_4_ = (uint)bVar84 * (int)fVar169 | (uint)!bVar84 * auVar98._8_4_;
              bVar84 = (bool)((byte)(uVar77 >> 3) & 1);
              local_560._12_4_ = (uint)bVar84 * (int)fVar170 | (uint)!bVar84 * auVar98._12_4_;
              bVar84 = (bool)((byte)(uVar77 >> 4) & 1);
              local_560._16_4_ = (uint)bVar84 * (int)fVar135 | (uint)!bVar84 * auVar98._16_4_;
              bVar84 = (bool)((byte)(uVar77 >> 5) & 1);
              local_560._20_4_ = (uint)bVar84 * (int)fVar136 | (uint)!bVar84 * auVar98._20_4_;
              bVar84 = (bool)((byte)(uVar77 >> 6) & 1);
              local_560._24_4_ = (uint)bVar84 * (int)fVar137 | (uint)!bVar84 * auVar98._24_4_;
              bVar84 = SUB81(uVar77 >> 7,0);
              local_560._28_4_ = (uint)bVar84 * auVar104._28_4_ | (uint)!bVar84 * auVar98._28_4_;
              local_960 = auVar97;
              goto LAB_01f2ae1f;
            }
          }
          local_630 = 0;
        }
LAB_01f2ae1f:
        auVar203 = ZEXT3264(local_860);
        auVar147 = ZEXT3264(local_840);
        auVar202 = ZEXT3264(local_820);
        auVar195 = ZEXT3264(auVar103);
        if (local_630 != 0) {
          auVar98 = vsubps_avx(ZEXT1632(auVar10),auVar94);
          auVar88 = vfmadd213ps_fma(auVar98,local_940,auVar94);
          uVar140 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar27._4_4_ = uVar140;
          auVar27._0_4_ = uVar140;
          auVar27._8_4_ = uVar140;
          auVar27._12_4_ = uVar140;
          auVar27._16_4_ = uVar140;
          auVar27._20_4_ = uVar140;
          auVar27._24_4_ = uVar140;
          auVar27._28_4_ = uVar140;
          auVar98 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                       CONCAT48(auVar88._8_4_ + auVar88._8_4_,
                                                                CONCAT44(auVar88._4_4_ +
                                                                         auVar88._4_4_,
                                                                         auVar88._0_4_ +
                                                                         auVar88._0_4_)))),auVar27);
          uVar141 = vcmpps_avx512vl(local_960,auVar98,6);
          local_630 = local_630 & (byte)uVar141;
          if (local_630 != 0) {
            auVar145._8_4_ = 0xbf800000;
            auVar145._0_8_ = 0xbf800000bf800000;
            auVar145._12_4_ = 0xbf800000;
            auVar145._16_4_ = 0xbf800000;
            auVar145._20_4_ = 0xbf800000;
            auVar145._24_4_ = 0xbf800000;
            auVar145._28_4_ = 0xbf800000;
            auVar28._8_4_ = 0x40000000;
            auVar28._0_8_ = 0x4000000040000000;
            auVar28._12_4_ = 0x40000000;
            auVar28._16_4_ = 0x40000000;
            auVar28._20_4_ = 0x40000000;
            auVar28._24_4_ = 0x40000000;
            auVar28._28_4_ = 0x40000000;
            local_6c0 = vfmadd132ps_avx512vl(local_560,auVar145,auVar28);
            local_560 = local_6c0;
            auVar98 = local_560;
            local_680 = 0;
            local_670 = local_970._0_8_;
            uStack_668 = local_970._8_8_;
            local_660 = local_750._0_8_;
            uStack_658 = local_750._8_8_;
            local_650 = local_760._0_8_;
            uStack_648 = local_760._8_8_;
            local_640 = local_770._0_8_;
            uStack_638 = local_770._8_8_;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar84 = true, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar139 = 1.0 / auVar182._0_4_;
                local_620[0] = fVar139 * (local_940._0_4_ + 0.0);
                local_620[1] = fVar139 * (local_940._4_4_ + 1.0);
                local_620[2] = fVar139 * (local_940._8_4_ + 2.0);
                local_620[3] = fVar139 * (local_940._12_4_ + 3.0);
                fStack_610 = fVar139 * (local_940._16_4_ + 4.0);
                fStack_60c = fVar139 * (local_940._20_4_ + 5.0);
                fStack_608 = fVar139 * (local_940._24_4_ + 6.0);
                fStack_604 = local_940._28_4_ + 7.0;
                local_560._0_8_ = local_6c0._0_8_;
                local_560._8_8_ = local_6c0._8_8_;
                local_560._16_8_ = local_6c0._16_8_;
                local_560._24_8_ = local_6c0._24_8_;
                local_600 = local_560._0_8_;
                uStack_5f8 = local_560._8_8_;
                uStack_5f0 = local_560._16_8_;
                uStack_5e8 = local_560._24_8_;
                local_5e0 = local_960;
                local_720 = 0;
                uVar83 = (ulong)local_630;
                for (uVar77 = uVar83; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000)
                {
                  local_720 = local_720 + 1;
                }
                auVar130 = vpbroadcastd_avx512f();
                local_500 = vmovdqa64_avx512f(auVar130);
                local_980 = local_750._0_4_;
                uStack_97c = local_750._4_4_;
                uStack_978 = local_750._8_8_;
                auVar130 = vpbroadcastd_avx512f();
                local_540 = vmovdqa64_avx512f(auVar130);
                local_8e0 = local_760._0_8_;
                uStack_8d8 = local_760._8_8_;
                local_8f0 = local_770._0_4_;
                fStack_8ec = local_770._4_4_;
                fStack_8e8 = local_770._8_4_;
                fStack_8e4 = local_770._12_4_;
                bVar84 = true;
                local_880 = fVar163;
                local_800 = auVar103;
                local_6e0 = local_940;
                local_6a0 = local_960;
                local_67c = iVar12;
                local_560 = auVar98;
                do {
                  auVar200 = auVar201._0_16_;
                  uVar140 = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_620[local_720]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_600 + local_720 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5e0 + local_720 * 4);
                  local_9c0.context = context->user;
                  fVar162 = local_200._0_4_;
                  fVar139 = 1.0 - fVar162;
                  auVar6 = vfnmadd231ss_fma(ZEXT416((uint)(fVar162 * (fVar139 + fVar139))),
                                            ZEXT416((uint)fVar139),ZEXT416((uint)fVar139));
                  auVar90 = local_200._0_16_;
                  auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar90,
                                            ZEXT416(0xc0a00000));
                  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162 * 3.0)),
                                            ZEXT416((uint)(fVar162 + fVar162)),auVar88);
                  auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar90,
                                            ZEXT416(0x40000000));
                  auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139 * -3.0)),
                                            ZEXT416((uint)(fVar139 + fVar139)),auVar88);
                  auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162)),auVar90,
                                            ZEXT416((uint)(fVar139 * -2.0)));
                  fVar139 = auVar6._0_4_ * 0.5;
                  fVar162 = auVar89._0_4_ * 0.5;
                  fVar168 = auVar88._0_4_ * 0.5;
                  fVar169 = auVar90._0_4_ * 0.5;
                  auVar155._0_4_ = fVar169 * local_8f0;
                  auVar155._4_4_ = fVar169 * fStack_8ec;
                  auVar155._8_4_ = fVar169 * fStack_8e8;
                  auVar155._12_4_ = fVar169 * fStack_8e4;
                  auVar171._4_4_ = fVar168;
                  auVar171._0_4_ = fVar168;
                  auVar171._8_4_ = fVar168;
                  auVar171._12_4_ = fVar168;
                  auVar73._8_8_ = uStack_8d8;
                  auVar73._0_8_ = local_8e0;
                  auVar88 = vfmadd132ps_fma(auVar171,auVar155,auVar73);
                  auVar156._4_4_ = fVar162;
                  auVar156._0_4_ = fVar162;
                  auVar156._8_4_ = fVar162;
                  auVar156._12_4_ = fVar162;
                  auVar71._4_4_ = uStack_97c;
                  auVar71._0_4_ = local_980;
                  auVar71._8_8_ = uStack_978;
                  auVar88 = vfmadd132ps_fma(auVar156,auVar88,auVar71);
                  auVar142._4_4_ = fVar139;
                  auVar142._0_4_ = fVar139;
                  auVar142._8_4_ = fVar139;
                  auVar142._12_4_ = fVar139;
                  auVar88 = vfmadd132ps_fma(auVar142,auVar88,local_970);
                  auVar130 = vbroadcastss_avx512f(auVar88);
                  auVar131 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar131,ZEXT1664(auVar88));
                  auVar131 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar131,ZEXT1664(auVar88));
                  local_2c0[0] = (RTCHitN)auVar130[0];
                  local_2c0[1] = (RTCHitN)auVar130[1];
                  local_2c0[2] = (RTCHitN)auVar130[2];
                  local_2c0[3] = (RTCHitN)auVar130[3];
                  local_2c0[4] = (RTCHitN)auVar130[4];
                  local_2c0[5] = (RTCHitN)auVar130[5];
                  local_2c0[6] = (RTCHitN)auVar130[6];
                  local_2c0[7] = (RTCHitN)auVar130[7];
                  local_2c0[8] = (RTCHitN)auVar130[8];
                  local_2c0[9] = (RTCHitN)auVar130[9];
                  local_2c0[10] = (RTCHitN)auVar130[10];
                  local_2c0[0xb] = (RTCHitN)auVar130[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar130[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar130[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar130[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar130[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar130[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar130[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar130[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar130[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar130[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar130[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar130[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar130[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar130[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar130[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar130[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar130[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar130[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar130[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar130[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar130[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar130[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar130[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar130[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar130[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar130[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar130[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar130[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar130[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar130[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar130[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar130[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar130[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar130[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar130[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar130[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar130[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar130[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar130[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar130[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar130[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar130[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar130[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar130[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar130[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar130[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar130[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar130[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar130[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar130[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar130[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar130[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar130[0x3f];
                  local_180 = local_540._0_8_;
                  uStack_178 = local_540._8_8_;
                  uStack_170 = local_540._16_8_;
                  uStack_168 = local_540._24_8_;
                  uStack_160 = local_540._32_8_;
                  uStack_158 = local_540._40_8_;
                  uStack_150 = local_540._48_8_;
                  uStack_148 = local_540._56_8_;
                  auVar130 = vmovdqa64_avx512f(local_500);
                  local_140 = vmovdqa64_avx512f(auVar130);
                  vpcmpeqd_avx2(auVar130._0_32_,auVar130._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_9c0.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_9c0.context)->instPrimID[0]));
                  local_5c0 = local_300;
                  local_9c0.valid = (int *)local_5c0;
                  local_9c0.geometryUserPtr = pGVar13->userPtr;
                  local_9c0.hit = local_2c0;
                  local_9c0.N = 0x10;
                  local_700 = (undefined4)uVar83;
                  uStack_6fc = (undefined4)(uVar83 >> 0x20);
                  local_9c0.ray = (RTCRayN *)ray;
                  if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar13->occlusionFilterN)(&local_9c0);
                    uVar83 = CONCAT44(uStack_6fc,local_700);
                    auVar190 = ZEXT1664(_local_990);
                    auVar195 = ZEXT3264(local_800);
                    auVar203 = ZEXT3264(local_860);
                    auVar147 = ZEXT3264(local_840);
                    auVar202 = ZEXT3264(local_820);
                    auVar204 = ZEXT3264(local_920);
                    auVar196 = ZEXT3264(local_7e0);
                    auVar199 = ZEXT3264(local_7c0);
                    auVar198 = ZEXT3264(local_740);
                    auVar197 = ZEXT3264(local_7a0);
                    auVar88 = vxorps_avx512vl(auVar200,auVar200);
                    auVar201 = ZEXT1664(auVar88);
                    fVar163 = local_880;
                  }
                  auVar88 = auVar201._0_16_;
                  auVar130 = vmovdqa64_avx512f(local_5c0);
                  uVar141 = vptestmd_avx512f(auVar130,auVar130);
                  if ((short)uVar141 != 0) {
                    p_Var16 = context->args->filter;
                    if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var16)(&local_9c0);
                      uVar83 = CONCAT44(uStack_6fc,local_700);
                      auVar190 = ZEXT1664(_local_990);
                      auVar195 = ZEXT3264(local_800);
                      auVar203 = ZEXT3264(local_860);
                      auVar147 = ZEXT3264(local_840);
                      auVar202 = ZEXT3264(local_820);
                      auVar204 = ZEXT3264(local_920);
                      auVar196 = ZEXT3264(local_7e0);
                      auVar199 = ZEXT3264(local_7c0);
                      auVar198 = ZEXT3264(local_740);
                      auVar197 = ZEXT3264(local_7a0);
                      auVar88 = vxorps_avx512vl(auVar88,auVar88);
                      auVar201 = ZEXT1664(auVar88);
                      fVar163 = local_880;
                    }
                    auVar103 = auVar195._0_32_;
                    auVar130 = vmovdqa64_avx512f(local_5c0);
                    uVar77 = vptestmd_avx512f(auVar130,auVar130);
                    auVar131 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar17 = (bool)((byte)uVar77 & 1);
                    auVar130._0_4_ =
                         (uint)bVar17 * auVar131._0_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x200);
                    bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
                    auVar130._4_4_ =
                         (uint)bVar17 * auVar131._4_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x204);
                    bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
                    auVar130._8_4_ =
                         (uint)bVar17 * auVar131._8_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x208);
                    bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
                    auVar130._12_4_ =
                         (uint)bVar17 * auVar131._12_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x20c);
                    bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
                    auVar130._16_4_ =
                         (uint)bVar17 * auVar131._16_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x210);
                    bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
                    auVar130._20_4_ =
                         (uint)bVar17 * auVar131._20_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x214);
                    bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                    auVar130._24_4_ =
                         (uint)bVar17 * auVar131._24_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x218);
                    bVar17 = (bool)((byte)(uVar77 >> 7) & 1);
                    auVar130._28_4_ =
                         (uint)bVar17 * auVar131._28_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x21c);
                    bVar17 = (bool)((byte)(uVar77 >> 8) & 1);
                    auVar130._32_4_ =
                         (uint)bVar17 * auVar131._32_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x220);
                    bVar17 = (bool)((byte)(uVar77 >> 9) & 1);
                    auVar130._36_4_ =
                         (uint)bVar17 * auVar131._36_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x224);
                    bVar17 = (bool)((byte)(uVar77 >> 10) & 1);
                    auVar130._40_4_ =
                         (uint)bVar17 * auVar131._40_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x228);
                    bVar17 = (bool)((byte)(uVar77 >> 0xb) & 1);
                    auVar130._44_4_ =
                         (uint)bVar17 * auVar131._44_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x22c);
                    bVar17 = (bool)((byte)(uVar77 >> 0xc) & 1);
                    auVar130._48_4_ =
                         (uint)bVar17 * auVar131._48_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x230);
                    bVar17 = (bool)((byte)(uVar77 >> 0xd) & 1);
                    auVar130._52_4_ =
                         (uint)bVar17 * auVar131._52_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x234);
                    bVar17 = (bool)((byte)(uVar77 >> 0xe) & 1);
                    auVar130._56_4_ =
                         (uint)bVar17 * auVar131._56_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x238);
                    bVar17 = SUB81(uVar77 >> 0xf,0);
                    auVar130._60_4_ =
                         (uint)bVar17 * auVar131._60_4_ |
                         (uint)!bVar17 * *(int *)(local_9c0.ray + 0x23c);
                    *(undefined1 (*) [64])(local_9c0.ray + 0x200) = auVar130;
                    fVar139 = auVar190._0_4_;
                    if ((short)uVar77 != 0) break;
                  }
                  auVar103 = auVar195._0_32_;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar140;
                  uVar77 = local_720 & 0x3f;
                  local_720 = 0;
                  uVar83 = uVar83 ^ 1L << uVar77;
                  for (uVar77 = uVar83; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000
                      ) {
                    local_720 = local_720 + 1;
                  }
                  bVar84 = uVar83 != 0;
                  fVar139 = auVar190._0_4_;
                } while (bVar84);
              }
              goto LAB_01f2b454;
            }
          }
        }
        bVar84 = false;
      }
LAB_01f2b454:
      local_880 = fVar139;
      if (8 < iVar12) {
        auVar98 = vpbroadcastd_avx512vl();
        auVar195 = ZEXT3264(auVar98);
        fStack_718 = 1.0 / (float)local_4c0._0_4_;
        auVar190 = vpbroadcastd_avx512f();
        local_4c0 = vmovdqa64_avx512f(auVar190);
        auVar190 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar190);
        lVar86 = 8;
        fStack_87c = local_880;
        fStack_878 = local_880;
        fStack_874 = local_880;
        fStack_870 = local_880;
        fStack_86c = local_880;
        fStack_868 = local_880;
        fStack_864 = local_880;
        local_800 = auVar103;
        fStack_714 = fStack_718;
        fStack_710 = fStack_718;
        fStack_70c = fStack_718;
        fStack_708 = fStack_718;
        fStack_704 = fStack_718;
        local_700 = fVar163;
        uStack_6fc = fVar163;
        uStack_6f8 = fVar163;
        uStack_6f4 = fVar163;
        uStack_6f0 = fVar163;
        uStack_6ec = fVar163;
        uStack_6e8 = fVar163;
        uStack_6e4 = fVar163;
        local_720._0_4_ = fStack_718;
        local_720._4_4_ = fStack_718;
        do {
          auVar98 = vpbroadcastd_avx512vl();
          auVar99 = vpor_avx2(auVar98,_DAT_0205a920);
          uVar23 = vpcmpgtd_avx512vl(auVar195._0_32_,auVar99);
          auVar98 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar86 * 4 + lVar24);
          auVar97 = *(undefined1 (*) [32])(lVar24 + 0x22307f0 + lVar86 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar24 + 0x2230c74 + lVar86 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar24 + 0x22310f8 + lVar86 * 4);
          local_840 = auVar147._0_32_;
          auVar100 = vmulps_avx512vl(local_840,auVar108);
          local_860 = auVar203._0_32_;
          auVar107 = vmulps_avx512vl(local_860,auVar108);
          auVar52._4_4_ = auVar108._4_4_ * (float)local_3a0._4_4_;
          auVar52._0_4_ = auVar108._0_4_ * (float)local_3a0._0_4_;
          auVar52._8_4_ = auVar108._8_4_ * fStack_398;
          auVar52._12_4_ = auVar108._12_4_ * fStack_394;
          auVar52._16_4_ = auVar108._16_4_ * fStack_390;
          auVar52._20_4_ = auVar108._20_4_ * fStack_38c;
          auVar52._24_4_ = auVar108._24_4_ * fStack_388;
          auVar52._28_4_ = auVar99._28_4_;
          auVar174 = auVar204._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar100,auVar109,auVar174);
          local_820 = auVar202._0_32_;
          auVar100 = vfmadd231ps_avx512vl(auVar107,auVar109,local_820);
          auVar107 = vfmadd231ps_avx512vl(auVar52,auVar109,local_380);
          auVar173 = auVar199._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar173);
          auVar149 = auVar196._0_32_;
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,auVar149);
          auVar88 = vfmadd231ps_fma(auVar107,auVar97,local_360);
          auVar152 = auVar197._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar152);
          local_740 = auVar198._0_32_;
          auVar104 = vfmadd231ps_avx512vl(auVar100,auVar98,local_740);
          auVar99 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar86 * 4 + lVar24);
          auVar100 = *(undefined1 (*) [32])(lVar24 + 0x2232c10 + lVar86 * 4);
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar98,local_340);
          auVar107 = *(undefined1 (*) [32])(lVar24 + 0x2233094 + lVar86 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar24 + 0x2233518 + lVar86 * 4);
          auVar103 = vmulps_avx512vl(local_840,auVar101);
          auVar102 = vmulps_avx512vl(local_860,auVar101);
          auVar53._4_4_ = auVar101._4_4_ * (float)local_3a0._4_4_;
          auVar53._0_4_ = auVar101._0_4_ * (float)local_3a0._0_4_;
          auVar53._8_4_ = auVar101._8_4_ * fStack_398;
          auVar53._12_4_ = auVar101._12_4_ * fStack_394;
          auVar53._16_4_ = auVar101._16_4_ * fStack_390;
          auVar53._20_4_ = auVar101._20_4_ * fStack_38c;
          auVar53._24_4_ = auVar101._24_4_ * fStack_388;
          auVar53._28_4_ = uStack_384;
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,auVar174);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,local_820);
          auVar105 = vfmadd231ps_avx512vl(auVar53,auVar107,local_380);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar100,auVar173);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,auVar149);
          auVar89 = vfmadd231ps_fma(auVar105,auVar100,local_360);
          auVar105 = vfmadd231ps_avx512vl(auVar103,auVar99,auVar152);
          auVar94 = vfmadd231ps_avx512vl(auVar102,auVar99,local_740);
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar99,local_340);
          auVar95 = vmaxps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar89));
          auVar103 = vsubps_avx(auVar105,auVar96);
          auVar102 = vsubps_avx(auVar94,auVar104);
          auVar106 = vmulps_avx512vl(auVar104,auVar103);
          auVar120 = vmulps_avx512vl(auVar96,auVar102);
          auVar106 = vsubps_avx512vl(auVar106,auVar120);
          auVar120 = vmulps_avx512vl(auVar102,auVar102);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar103,auVar103);
          auVar95 = vmulps_avx512vl(auVar95,auVar95);
          auVar95 = vmulps_avx512vl(auVar95,auVar120);
          auVar106 = vmulps_avx512vl(auVar106,auVar106);
          uVar141 = vcmpps_avx512vl(auVar106,auVar95,2);
          local_630 = (byte)uVar23 & (byte)uVar141;
          if (local_630 == 0) {
            auVar190 = ZEXT3264(auVar149);
            auVar204 = ZEXT3264(auVar174);
          }
          else {
            auVar101 = vmulps_avx512vl(local_800,auVar101);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_400,auVar101);
            auVar100 = vfmadd213ps_avx512vl(auVar100,local_3e0,auVar107);
            auVar99 = vfmadd213ps_avx512vl(auVar99,local_3c0,auVar100);
            auVar108 = vmulps_avx512vl(local_800,auVar108);
            auVar109 = vfmadd213ps_avx512vl(auVar109,local_400,auVar108);
            auVar97 = vfmadd213ps_avx512vl(auVar97,local_3e0,auVar109);
            auVar100 = vfmadd213ps_avx512vl(auVar98,local_3c0,auVar97);
            auVar98 = *(undefined1 (*) [32])(lVar24 + 0x223157c + lVar86 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar24 + 0x2231a00 + lVar86 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar24 + 0x2231e84 + lVar86 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar24 + 0x2232308 + lVar86 * 4);
            auVar107 = vmulps_avx512vl(local_840,auVar108);
            auVar101 = vmulps_avx512vl(local_860,auVar108);
            auVar108 = vmulps_avx512vl(local_800,auVar108);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar174);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar109,local_820);
            auVar109 = vfmadd231ps_avx512vl(auVar108,local_400,auVar109);
            auVar108 = vfmadd231ps_avx512vl(auVar107,auVar97,auVar173);
            auVar107 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar149);
            auVar97 = vfmadd231ps_avx512vl(auVar109,local_3e0,auVar97);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar98,auVar152);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar98,local_740);
            auVar101 = vfmadd231ps_avx512vl(auVar97,local_3c0,auVar98);
            auVar98 = *(undefined1 (*) [32])(lVar24 + 0x223399c + lVar86 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar24 + 0x22342a4 + lVar86 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar24 + 0x2234728 + lVar86 * 4);
            auVar95 = vmulps_avx512vl(local_840,auVar109);
            auVar106 = vmulps_avx512vl(local_860,auVar109);
            auVar109 = vmulps_avx512vl(local_800,auVar109);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar97,auVar174);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,local_820);
            auVar109 = vfmadd231ps_avx512vl(auVar109,local_400,auVar97);
            auVar97 = *(undefined1 (*) [32])(lVar24 + 0x2233e20 + lVar86 * 4);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar97,auVar173);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,auVar149);
            auVar97 = vfmadd231ps_avx512vl(auVar109,local_3e0,auVar97);
            auVar109 = vfmadd231ps_avx512vl(auVar95,auVar98,auVar152);
            auVar95 = vfmadd231ps_avx512vl(auVar106,auVar98,local_740);
            auVar97 = vfmadd231ps_avx512vl(auVar97,local_3c0,auVar98);
            auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar108,auVar106);
            vandps_avx512vl(auVar107,auVar106);
            auVar98 = vmaxps_avx(auVar106,auVar106);
            vandps_avx512vl(auVar101,auVar106);
            auVar98 = vmaxps_avx(auVar98,auVar106);
            auVar75._4_4_ = fStack_87c;
            auVar75._0_4_ = local_880;
            auVar75._8_4_ = fStack_878;
            auVar75._12_4_ = fStack_874;
            auVar75._16_4_ = fStack_870;
            auVar75._20_4_ = fStack_86c;
            auVar75._24_4_ = fStack_868;
            auVar75._28_4_ = fStack_864;
            uVar77 = vcmpps_avx512vl(auVar98,auVar75,1);
            bVar17 = (bool)((byte)uVar77 & 1);
            auVar121._0_4_ = (float)((uint)bVar17 * auVar103._0_4_ | (uint)!bVar17 * auVar108._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar108._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * auVar108._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * auVar108._12_4_);
            bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar121._16_4_ =
                 (float)((uint)bVar17 * auVar103._16_4_ | (uint)!bVar17 * auVar108._16_4_);
            bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar121._20_4_ =
                 (float)((uint)bVar17 * auVar103._20_4_ | (uint)!bVar17 * auVar108._20_4_);
            bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar121._24_4_ =
                 (float)((uint)bVar17 * auVar103._24_4_ | (uint)!bVar17 * auVar108._24_4_);
            bVar17 = SUB81(uVar77 >> 7,0);
            auVar121._28_4_ = (uint)bVar17 * auVar103._28_4_ | (uint)!bVar17 * auVar108._28_4_;
            bVar17 = (bool)((byte)uVar77 & 1);
            auVar122._0_4_ = (float)((uint)bVar17 * auVar102._0_4_ | (uint)!bVar17 * auVar107._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar17 * auVar102._4_4_ | (uint)!bVar17 * auVar107._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar17 * auVar102._8_4_ | (uint)!bVar17 * auVar107._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar17 * auVar102._12_4_ | (uint)!bVar17 * auVar107._12_4_);
            bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar122._16_4_ =
                 (float)((uint)bVar17 * auVar102._16_4_ | (uint)!bVar17 * auVar107._16_4_);
            bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar122._20_4_ =
                 (float)((uint)bVar17 * auVar102._20_4_ | (uint)!bVar17 * auVar107._20_4_);
            bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar122._24_4_ =
                 (float)((uint)bVar17 * auVar102._24_4_ | (uint)!bVar17 * auVar107._24_4_);
            bVar17 = SUB81(uVar77 >> 7,0);
            auVar122._28_4_ = (uint)bVar17 * auVar102._28_4_ | (uint)!bVar17 * auVar107._28_4_;
            vandps_avx512vl(auVar109,auVar106);
            vandps_avx512vl(auVar95,auVar106);
            auVar98 = vmaxps_avx(auVar122,auVar122);
            vandps_avx512vl(auVar97,auVar106);
            auVar98 = vmaxps_avx(auVar98,auVar122);
            uVar77 = vcmpps_avx512vl(auVar98,auVar75,1);
            bVar17 = (bool)((byte)uVar77 & 1);
            auVar123._0_4_ = (uint)bVar17 * auVar103._0_4_ | (uint)!bVar17 * auVar109._0_4_;
            bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar123._4_4_ = (uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar109._4_4_;
            bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar123._8_4_ = (uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * auVar109._8_4_;
            bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar123._12_4_ = (uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * auVar109._12_4_;
            bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar123._16_4_ = (uint)bVar17 * auVar103._16_4_ | (uint)!bVar17 * auVar109._16_4_;
            bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar123._20_4_ = (uint)bVar17 * auVar103._20_4_ | (uint)!bVar17 * auVar109._20_4_;
            bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar123._24_4_ = (uint)bVar17 * auVar103._24_4_ | (uint)!bVar17 * auVar109._24_4_;
            bVar17 = SUB81(uVar77 >> 7,0);
            auVar123._28_4_ = (uint)bVar17 * auVar103._28_4_ | (uint)!bVar17 * auVar109._28_4_;
            bVar17 = (bool)((byte)uVar77 & 1);
            auVar124._0_4_ = (float)((uint)bVar17 * auVar102._0_4_ | (uint)!bVar17 * auVar95._0_4_);
            bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar17 * auVar102._4_4_ | (uint)!bVar17 * auVar95._4_4_);
            bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar17 * auVar102._8_4_ | (uint)!bVar17 * auVar95._8_4_);
            bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar17 * auVar102._12_4_ | (uint)!bVar17 * auVar95._12_4_);
            bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar124._16_4_ =
                 (float)((uint)bVar17 * auVar102._16_4_ | (uint)!bVar17 * auVar95._16_4_);
            bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar124._20_4_ =
                 (float)((uint)bVar17 * auVar102._20_4_ | (uint)!bVar17 * auVar95._20_4_);
            bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar124._24_4_ =
                 (float)((uint)bVar17 * auVar102._24_4_ | (uint)!bVar17 * auVar95._24_4_);
            bVar17 = SUB81(uVar77 >> 7,0);
            auVar124._28_4_ = (uint)bVar17 * auVar102._28_4_ | (uint)!bVar17 * auVar95._28_4_;
            auVar184._8_4_ = 0x80000000;
            auVar184._0_8_ = 0x8000000080000000;
            auVar184._12_4_ = 0x80000000;
            auVar184._16_4_ = 0x80000000;
            auVar184._20_4_ = 0x80000000;
            auVar184._24_4_ = 0x80000000;
            auVar184._28_4_ = 0x80000000;
            auVar98 = vxorps_avx512vl(auVar123,auVar184);
            auVar95 = auVar201._0_32_;
            auVar97 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar95);
            auVar90 = vfmadd231ps_fma(auVar97,auVar122,auVar122);
            auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
            auVar194._8_4_ = 0xbf000000;
            auVar194._0_8_ = 0xbf000000bf000000;
            auVar194._12_4_ = 0xbf000000;
            auVar194._16_4_ = 0xbf000000;
            auVar194._20_4_ = 0xbf000000;
            auVar194._24_4_ = 0xbf000000;
            auVar194._28_4_ = 0xbf000000;
            fVar163 = auVar97._0_4_;
            fVar139 = auVar97._4_4_;
            fVar162 = auVar97._8_4_;
            fVar168 = auVar97._12_4_;
            fVar169 = auVar97._16_4_;
            fVar170 = auVar97._20_4_;
            fVar154 = auVar97._24_4_;
            auVar54._4_4_ = fVar139 * fVar139 * fVar139 * auVar90._4_4_ * -0.5;
            auVar54._0_4_ = fVar163 * fVar163 * fVar163 * auVar90._0_4_ * -0.5;
            auVar54._8_4_ = fVar162 * fVar162 * fVar162 * auVar90._8_4_ * -0.5;
            auVar54._12_4_ = fVar168 * fVar168 * fVar168 * auVar90._12_4_ * -0.5;
            auVar54._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
            auVar54._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
            auVar54._24_4_ = fVar154 * fVar154 * fVar154 * -0.0;
            auVar54._28_4_ = auVar122._28_4_;
            auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar97 = vfmadd231ps_avx512vl(auVar54,auVar109,auVar97);
            auVar55._4_4_ = auVar122._4_4_ * auVar97._4_4_;
            auVar55._0_4_ = auVar122._0_4_ * auVar97._0_4_;
            auVar55._8_4_ = auVar122._8_4_ * auVar97._8_4_;
            auVar55._12_4_ = auVar122._12_4_ * auVar97._12_4_;
            auVar55._16_4_ = auVar122._16_4_ * auVar97._16_4_;
            auVar55._20_4_ = auVar122._20_4_ * auVar97._20_4_;
            auVar55._24_4_ = auVar122._24_4_ * auVar97._24_4_;
            auVar55._28_4_ = 0;
            auVar56._4_4_ = auVar97._4_4_ * -auVar121._4_4_;
            auVar56._0_4_ = auVar97._0_4_ * -auVar121._0_4_;
            auVar56._8_4_ = auVar97._8_4_ * -auVar121._8_4_;
            auVar56._12_4_ = auVar97._12_4_ * -auVar121._12_4_;
            auVar56._16_4_ = auVar97._16_4_ * -auVar121._16_4_;
            auVar56._20_4_ = auVar97._20_4_ * -auVar121._20_4_;
            auVar56._24_4_ = auVar97._24_4_ * -auVar121._24_4_;
            auVar56._28_4_ = auVar122._28_4_;
            auVar108 = vmulps_avx512vl(auVar97,auVar95);
            auVar97 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar95);
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar124,auVar124);
            auVar107 = vrsqrt14ps_avx512vl(auVar97);
            auVar97 = vmulps_avx512vl(auVar97,auVar194);
            fVar163 = auVar107._0_4_;
            fVar139 = auVar107._4_4_;
            fVar162 = auVar107._8_4_;
            fVar168 = auVar107._12_4_;
            fVar169 = auVar107._16_4_;
            fVar170 = auVar107._20_4_;
            fVar154 = auVar107._24_4_;
            auVar57._4_4_ = fVar139 * fVar139 * fVar139 * auVar97._4_4_;
            auVar57._0_4_ = fVar163 * fVar163 * fVar163 * auVar97._0_4_;
            auVar57._8_4_ = fVar162 * fVar162 * fVar162 * auVar97._8_4_;
            auVar57._12_4_ = fVar168 * fVar168 * fVar168 * auVar97._12_4_;
            auVar57._16_4_ = fVar169 * fVar169 * fVar169 * auVar97._16_4_;
            auVar57._20_4_ = fVar170 * fVar170 * fVar170 * auVar97._20_4_;
            auVar57._24_4_ = fVar154 * fVar154 * fVar154 * auVar97._24_4_;
            auVar57._28_4_ = auVar97._28_4_;
            auVar97 = vfmadd231ps_avx512vl(auVar57,auVar109,auVar107);
            auVar58._4_4_ = auVar124._4_4_ * auVar97._4_4_;
            auVar58._0_4_ = auVar124._0_4_ * auVar97._0_4_;
            auVar58._8_4_ = auVar124._8_4_ * auVar97._8_4_;
            auVar58._12_4_ = auVar124._12_4_ * auVar97._12_4_;
            auVar58._16_4_ = auVar124._16_4_ * auVar97._16_4_;
            auVar58._20_4_ = auVar124._20_4_ * auVar97._20_4_;
            auVar58._24_4_ = auVar124._24_4_ * auVar97._24_4_;
            auVar58._28_4_ = auVar107._28_4_;
            auVar59._4_4_ = auVar97._4_4_ * auVar98._4_4_;
            auVar59._0_4_ = auVar97._0_4_ * auVar98._0_4_;
            auVar59._8_4_ = auVar97._8_4_ * auVar98._8_4_;
            auVar59._12_4_ = auVar97._12_4_ * auVar98._12_4_;
            auVar59._16_4_ = auVar97._16_4_ * auVar98._16_4_;
            auVar59._20_4_ = auVar97._20_4_ * auVar98._20_4_;
            auVar59._24_4_ = auVar97._24_4_ * auVar98._24_4_;
            auVar59._28_4_ = auVar98._28_4_;
            auVar98 = vmulps_avx512vl(auVar97,auVar95);
            auVar90 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar88),auVar96);
            auVar97 = ZEXT1632(auVar88);
            auVar6 = vfmadd213ps_fma(auVar56,auVar97,auVar104);
            auVar109 = vfmadd213ps_avx512vl(auVar108,auVar97,auVar100);
            auVar107 = vfmadd213ps_avx512vl(auVar58,ZEXT1632(auVar89),auVar105);
            auVar10 = vfnmadd213ps_fma(auVar55,auVar97,auVar96);
            auVar101 = ZEXT1632(auVar89);
            auVar200 = vfmadd213ps_fma(auVar59,auVar101,auVar94);
            auVar91 = vfnmadd213ps_fma(auVar56,auVar97,auVar104);
            auVar7 = vfmadd213ps_fma(auVar98,auVar101,auVar99);
            auVar104 = ZEXT1632(auVar88);
            auVar93 = vfnmadd231ps_fma(auVar100,auVar104,auVar108);
            auVar92 = vfnmadd213ps_fma(auVar58,auVar101,auVar105);
            auVar148 = vfnmadd213ps_fma(auVar59,auVar101,auVar94);
            auVar150 = vfnmadd231ps_fma(auVar99,ZEXT1632(auVar89),auVar98);
            auVar99 = vsubps_avx512vl(auVar107,ZEXT1632(auVar10));
            auVar98 = vsubps_avx(ZEXT1632(auVar200),ZEXT1632(auVar91));
            auVar97 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar93));
            auVar60._4_4_ = auVar98._4_4_ * auVar93._4_4_;
            auVar60._0_4_ = auVar98._0_4_ * auVar93._0_4_;
            auVar60._8_4_ = auVar98._8_4_ * auVar93._8_4_;
            auVar60._12_4_ = auVar98._12_4_ * auVar93._12_4_;
            auVar60._16_4_ = auVar98._16_4_ * 0.0;
            auVar60._20_4_ = auVar98._20_4_ * 0.0;
            auVar60._24_4_ = auVar98._24_4_ * 0.0;
            auVar60._28_4_ = auVar108._28_4_;
            auVar88 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar91),auVar97);
            auVar61._4_4_ = auVar97._4_4_ * auVar10._4_4_;
            auVar61._0_4_ = auVar97._0_4_ * auVar10._0_4_;
            auVar61._8_4_ = auVar97._8_4_ * auVar10._8_4_;
            auVar61._12_4_ = auVar97._12_4_ * auVar10._12_4_;
            auVar61._16_4_ = auVar97._16_4_ * 0.0;
            auVar61._20_4_ = auVar97._20_4_ * 0.0;
            auVar61._24_4_ = auVar97._24_4_ * 0.0;
            auVar61._28_4_ = auVar97._28_4_;
            auVar8 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar93),auVar99);
            auVar62._4_4_ = auVar91._4_4_ * auVar99._4_4_;
            auVar62._0_4_ = auVar91._0_4_ * auVar99._0_4_;
            auVar62._8_4_ = auVar91._8_4_ * auVar99._8_4_;
            auVar62._12_4_ = auVar91._12_4_ * auVar99._12_4_;
            auVar62._16_4_ = auVar99._16_4_ * 0.0;
            auVar62._20_4_ = auVar99._20_4_ * 0.0;
            auVar62._24_4_ = auVar99._24_4_ * 0.0;
            auVar62._28_4_ = auVar99._28_4_;
            auVar9 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar10),auVar98);
            auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar95,ZEXT1632(auVar8));
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,ZEXT1632(auVar88));
            uVar77 = vcmpps_avx512vl(auVar98,auVar95,2);
            bVar79 = (byte)uVar77;
            fVar153 = (float)((uint)(bVar79 & 1) * auVar90._0_4_ |
                             (uint)!(bool)(bVar79 & 1) * auVar92._0_4_);
            bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
            fVar133 = (float)((uint)bVar17 * auVar90._4_4_ | (uint)!bVar17 * auVar92._4_4_);
            bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
            fVar135 = (float)((uint)bVar17 * auVar90._8_4_ | (uint)!bVar17 * auVar92._8_4_);
            bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
            fVar137 = (float)((uint)bVar17 * auVar90._12_4_ | (uint)!bVar17 * auVar92._12_4_);
            auVar101 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar153))));
            fVar132 = (float)((uint)(bVar79 & 1) * auVar6._0_4_ |
                             (uint)!(bool)(bVar79 & 1) * auVar148._0_4_);
            bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
            fVar134 = (float)((uint)bVar17 * auVar6._4_4_ | (uint)!bVar17 * auVar148._4_4_);
            bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
            fVar136 = (float)((uint)bVar17 * auVar6._8_4_ | (uint)!bVar17 * auVar148._8_4_);
            bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
            fVar138 = (float)((uint)bVar17 * auVar6._12_4_ | (uint)!bVar17 * auVar148._12_4_);
            auVar103 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar132))));
            auVar125._0_4_ =
                 (float)((uint)(bVar79 & 1) * auVar109._0_4_ |
                        (uint)!(bool)(bVar79 & 1) * auVar150._0_4_);
            bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar125._4_4_ = (float)((uint)bVar17 * auVar109._4_4_ | (uint)!bVar17 * auVar150._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar125._8_4_ = (float)((uint)bVar17 * auVar109._8_4_ | (uint)!bVar17 * auVar150._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar125._12_4_ =
                 (float)((uint)bVar17 * auVar109._12_4_ | (uint)!bVar17 * auVar150._12_4_);
            fVar163 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar109._16_4_);
            auVar125._16_4_ = fVar163;
            fVar139 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar109._20_4_);
            auVar125._20_4_ = fVar139;
            fVar162 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar109._24_4_);
            auVar125._24_4_ = fVar162;
            iVar1 = (uint)(byte)(uVar77 >> 7) * auVar109._28_4_;
            auVar125._28_4_ = iVar1;
            auVar98 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar107);
            auVar126._0_4_ =
                 (uint)(bVar79 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar88._0_4_;
            bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar126._4_4_ = (uint)bVar17 * auVar98._4_4_ | (uint)!bVar17 * auVar88._4_4_;
            bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar126._8_4_ = (uint)bVar17 * auVar98._8_4_ | (uint)!bVar17 * auVar88._8_4_;
            bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar126._12_4_ = (uint)bVar17 * auVar98._12_4_ | (uint)!bVar17 * auVar88._12_4_;
            auVar126._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar98._16_4_;
            auVar126._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar98._20_4_;
            auVar126._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar98._24_4_;
            auVar126._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar98._28_4_;
            auVar98 = vblendmps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar200));
            auVar127._0_4_ =
                 (float)((uint)(bVar79 & 1) * auVar98._0_4_ |
                        (uint)!(bool)(bVar79 & 1) * auVar90._0_4_);
            bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar17 * auVar98._4_4_ | (uint)!bVar17 * auVar90._4_4_);
            bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar17 * auVar98._8_4_ | (uint)!bVar17 * auVar90._8_4_);
            bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar17 * auVar98._12_4_ | (uint)!bVar17 * auVar90._12_4_);
            fVar170 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar98._16_4_);
            auVar127._16_4_ = fVar170;
            fVar169 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar98._20_4_);
            auVar127._20_4_ = fVar169;
            fVar168 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar98._24_4_);
            auVar127._24_4_ = fVar168;
            auVar127._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar98._28_4_;
            auVar98 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar7));
            auVar128._0_4_ =
                 (float)((uint)(bVar79 & 1) * auVar98._0_4_ |
                        (uint)!(bool)(bVar79 & 1) * auVar6._0_4_);
            bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar17 * auVar98._4_4_ | (uint)!bVar17 * auVar6._4_4_);
            bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar17 * auVar98._8_4_ | (uint)!bVar17 * auVar6._8_4_);
            bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar128._12_4_ = (float)((uint)bVar17 * auVar98._12_4_ | (uint)!bVar17 * auVar6._12_4_)
            ;
            fVar87 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar98._16_4_);
            auVar128._16_4_ = fVar87;
            fVar161 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar98._20_4_);
            auVar128._20_4_ = fVar161;
            fVar154 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar98._24_4_);
            auVar128._24_4_ = fVar154;
            iVar2 = (uint)(byte)(uVar77 >> 7) * auVar98._28_4_;
            auVar128._28_4_ = iVar2;
            auVar129._0_4_ =
                 (uint)(bVar79 & 1) * (int)auVar10._0_4_ |
                 (uint)!(bool)(bVar79 & 1) * auVar107._0_4_;
            bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar129._4_4_ = (uint)bVar17 * (int)auVar10._4_4_ | (uint)!bVar17 * auVar107._4_4_;
            bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar129._8_4_ = (uint)bVar17 * (int)auVar10._8_4_ | (uint)!bVar17 * auVar107._8_4_;
            bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar129._12_4_ = (uint)bVar17 * (int)auVar10._12_4_ | (uint)!bVar17 * auVar107._12_4_;
            auVar129._16_4_ = (uint)!(bool)((byte)(uVar77 >> 4) & 1) * auVar107._16_4_;
            auVar129._20_4_ = (uint)!(bool)((byte)(uVar77 >> 5) & 1) * auVar107._20_4_;
            auVar129._24_4_ = (uint)!(bool)((byte)(uVar77 >> 6) & 1) * auVar107._24_4_;
            auVar129._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar107._28_4_;
            bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar77 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar77 >> 3) & 1);
            bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar77 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar107 = vsubps_avx512vl(auVar129,auVar101);
            auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar91._12_4_ |
                                                    (uint)!bVar21 * auVar200._12_4_,
                                                    CONCAT48((uint)bVar20 * (int)auVar91._8_4_ |
                                                             (uint)!bVar20 * auVar200._8_4_,
                                                             CONCAT44((uint)bVar17 *
                                                                      (int)auVar91._4_4_ |
                                                                      (uint)!bVar17 * auVar200._4_4_
                                                                      ,(uint)(bVar79 & 1) *
                                                                       (int)auVar91._0_4_ |
                                                                       (uint)!(bool)(bVar79 & 1) *
                                                                       auVar200._0_4_)))),auVar103);
            auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar93._12_4_ |
                                                     (uint)!bVar22 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar93._8_4_ |
                                                              (uint)!bVar19 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar18 *
                                                                       (int)auVar93._4_4_ |
                                                                       (uint)!bVar18 * auVar7._4_4_,
                                                                       (uint)(bVar79 & 1) *
                                                                       (int)auVar93._0_4_ |
                                                                       (uint)!(bool)(bVar79 & 1) *
                                                                       auVar7._0_4_)))),auVar125);
            auVar108 = vsubps_avx(auVar101,auVar126);
            auVar99 = vsubps_avx(auVar103,auVar127);
            auVar100 = vsubps_avx(auVar125,auVar128);
            auVar63._4_4_ = auVar109._4_4_ * fVar133;
            auVar63._0_4_ = auVar109._0_4_ * fVar153;
            auVar63._8_4_ = auVar109._8_4_ * fVar135;
            auVar63._12_4_ = auVar109._12_4_ * fVar137;
            auVar63._16_4_ = auVar109._16_4_ * 0.0;
            auVar63._20_4_ = auVar109._20_4_ * 0.0;
            auVar63._24_4_ = auVar109._24_4_ * 0.0;
            auVar63._28_4_ = 0;
            auVar88 = vfmsub231ps_fma(auVar63,auVar125,auVar107);
            auVar160._0_4_ = fVar132 * auVar107._0_4_;
            auVar160._4_4_ = fVar134 * auVar107._4_4_;
            auVar160._8_4_ = fVar136 * auVar107._8_4_;
            auVar160._12_4_ = fVar138 * auVar107._12_4_;
            auVar160._16_4_ = auVar107._16_4_ * 0.0;
            auVar160._20_4_ = auVar107._20_4_ * 0.0;
            auVar160._24_4_ = auVar107._24_4_ * 0.0;
            auVar160._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar160,auVar101,auVar97);
            auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar95,ZEXT1632(auVar88));
            auVar166._0_4_ = auVar97._0_4_ * auVar125._0_4_;
            auVar166._4_4_ = auVar97._4_4_ * auVar125._4_4_;
            auVar166._8_4_ = auVar97._8_4_ * auVar125._8_4_;
            auVar166._12_4_ = auVar97._12_4_ * auVar125._12_4_;
            auVar166._16_4_ = auVar97._16_4_ * fVar163;
            auVar166._20_4_ = auVar97._20_4_ * fVar139;
            auVar166._24_4_ = auVar97._24_4_ * fVar162;
            auVar166._28_4_ = 0;
            auVar88 = vfmsub231ps_fma(auVar166,auVar103,auVar109);
            auVar102 = vfmadd231ps_avx512vl(auVar98,auVar95,ZEXT1632(auVar88));
            auVar98 = vmulps_avx512vl(auVar100,auVar126);
            auVar98 = vfmsub231ps_avx512vl(auVar98,auVar108,auVar128);
            auVar64._4_4_ = auVar99._4_4_ * auVar128._4_4_;
            auVar64._0_4_ = auVar99._0_4_ * auVar128._0_4_;
            auVar64._8_4_ = auVar99._8_4_ * auVar128._8_4_;
            auVar64._12_4_ = auVar99._12_4_ * auVar128._12_4_;
            auVar64._16_4_ = auVar99._16_4_ * fVar87;
            auVar64._20_4_ = auVar99._20_4_ * fVar161;
            auVar64._24_4_ = auVar99._24_4_ * fVar154;
            auVar64._28_4_ = iVar2;
            auVar88 = vfmsub231ps_fma(auVar64,auVar127,auVar100);
            auVar167._0_4_ = auVar127._0_4_ * auVar108._0_4_;
            auVar167._4_4_ = auVar127._4_4_ * auVar108._4_4_;
            auVar167._8_4_ = auVar127._8_4_ * auVar108._8_4_;
            auVar167._12_4_ = auVar127._12_4_ * auVar108._12_4_;
            auVar167._16_4_ = fVar170 * auVar108._16_4_;
            auVar167._20_4_ = fVar169 * auVar108._20_4_;
            auVar167._24_4_ = fVar168 * auVar108._24_4_;
            auVar167._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar167,auVar99,auVar126);
            auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar95,auVar98);
            auVar96 = vfmadd231ps_avx512vl(auVar98,auVar95,ZEXT1632(auVar88));
            auVar98 = vmaxps_avx(auVar102,auVar96);
            uVar141 = vcmpps_avx512vl(auVar98,auVar95,2);
            local_630 = local_630 & (byte)uVar141;
            auVar190 = ZEXT3264(auVar149);
            if (local_630 == 0) {
LAB_01f2c092:
              local_630 = 0;
            }
            else {
              auVar65._4_4_ = auVar100._4_4_ * auVar97._4_4_;
              auVar65._0_4_ = auVar100._0_4_ * auVar97._0_4_;
              auVar65._8_4_ = auVar100._8_4_ * auVar97._8_4_;
              auVar65._12_4_ = auVar100._12_4_ * auVar97._12_4_;
              auVar65._16_4_ = auVar100._16_4_ * auVar97._16_4_;
              auVar65._20_4_ = auVar100._20_4_ * auVar97._20_4_;
              auVar65._24_4_ = auVar100._24_4_ * auVar97._24_4_;
              auVar65._28_4_ = auVar98._28_4_;
              auVar6 = vfmsub231ps_fma(auVar65,auVar99,auVar109);
              auVar66._4_4_ = auVar109._4_4_ * auVar108._4_4_;
              auVar66._0_4_ = auVar109._0_4_ * auVar108._0_4_;
              auVar66._8_4_ = auVar109._8_4_ * auVar108._8_4_;
              auVar66._12_4_ = auVar109._12_4_ * auVar108._12_4_;
              auVar66._16_4_ = auVar109._16_4_ * auVar108._16_4_;
              auVar66._20_4_ = auVar109._20_4_ * auVar108._20_4_;
              auVar66._24_4_ = auVar109._24_4_ * auVar108._24_4_;
              auVar66._28_4_ = auVar109._28_4_;
              auVar90 = vfmsub231ps_fma(auVar66,auVar107,auVar100);
              auVar67._4_4_ = auVar99._4_4_ * auVar107._4_4_;
              auVar67._0_4_ = auVar99._0_4_ * auVar107._0_4_;
              auVar67._8_4_ = auVar99._8_4_ * auVar107._8_4_;
              auVar67._12_4_ = auVar99._12_4_ * auVar107._12_4_;
              auVar67._16_4_ = auVar99._16_4_ * auVar107._16_4_;
              auVar67._20_4_ = auVar99._20_4_ * auVar107._20_4_;
              auVar67._24_4_ = auVar99._24_4_ * auVar107._24_4_;
              auVar67._28_4_ = auVar99._28_4_;
              auVar200 = vfmsub231ps_fma(auVar67,auVar108,auVar97);
              auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar90),ZEXT1632(auVar200));
              auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar6),auVar95);
              auVar97 = vrcp14ps_avx512vl(auVar98);
              auVar30._8_4_ = 0x3f800000;
              auVar30._0_8_ = &DAT_3f8000003f800000;
              auVar30._12_4_ = 0x3f800000;
              auVar30._16_4_ = 0x3f800000;
              auVar30._20_4_ = 0x3f800000;
              auVar30._24_4_ = 0x3f800000;
              auVar30._28_4_ = 0x3f800000;
              auVar109 = vfnmadd213ps_avx512vl(auVar97,auVar98,auVar30);
              auVar88 = vfmadd132ps_fma(auVar109,auVar97,auVar97);
              auVar68._4_4_ = auVar200._4_4_ * auVar125._4_4_;
              auVar68._0_4_ = auVar200._0_4_ * auVar125._0_4_;
              auVar68._8_4_ = auVar200._8_4_ * auVar125._8_4_;
              auVar68._12_4_ = auVar200._12_4_ * auVar125._12_4_;
              auVar68._16_4_ = fVar163 * 0.0;
              auVar68._20_4_ = fVar139 * 0.0;
              auVar68._24_4_ = fVar162 * 0.0;
              auVar68._28_4_ = iVar1;
              auVar90 = vfmadd231ps_fma(auVar68,auVar103,ZEXT1632(auVar90));
              auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar101,ZEXT1632(auVar6));
              fVar163 = auVar88._0_4_;
              fVar139 = auVar88._4_4_;
              fVar162 = auVar88._8_4_;
              fVar168 = auVar88._12_4_;
              auVar97 = ZEXT1632(CONCAT412(auVar90._12_4_ * fVar168,
                                           CONCAT48(auVar90._8_4_ * fVar162,
                                                    CONCAT44(auVar90._4_4_ * fVar139,
                                                             auVar90._0_4_ * fVar163))));
              auVar76._4_4_ = uStack_6fc;
              auVar76._0_4_ = local_700;
              auVar76._8_4_ = uStack_6f8;
              auVar76._12_4_ = uStack_6f4;
              auVar76._16_4_ = uStack_6f0;
              auVar76._20_4_ = uStack_6ec;
              auVar76._24_4_ = uStack_6e8;
              auVar76._28_4_ = uStack_6e4;
              uVar141 = vcmpps_avx512vl(auVar97,auVar76,0xd);
              uVar140 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar31._4_4_ = uVar140;
              auVar31._0_4_ = uVar140;
              auVar31._8_4_ = uVar140;
              auVar31._12_4_ = uVar140;
              auVar31._16_4_ = uVar140;
              auVar31._20_4_ = uVar140;
              auVar31._24_4_ = uVar140;
              auVar31._28_4_ = uVar140;
              uVar23 = vcmpps_avx512vl(auVar97,auVar31,2);
              local_630 = (byte)uVar141 & (byte)uVar23 & local_630;
              if (local_630 == 0) goto LAB_01f2c092;
              uVar141 = vcmpps_avx512vl(auVar98,auVar95,4);
              if ((local_630 & (byte)uVar141) == 0) {
                local_630 = 0;
              }
              else {
                local_630 = local_630 & (byte)uVar141;
                fVar169 = auVar102._0_4_ * fVar163;
                fVar170 = auVar102._4_4_ * fVar139;
                auVar69._4_4_ = fVar170;
                auVar69._0_4_ = fVar169;
                fVar154 = auVar102._8_4_ * fVar162;
                auVar69._8_4_ = fVar154;
                fVar161 = auVar102._12_4_ * fVar168;
                auVar69._12_4_ = fVar161;
                fVar87 = auVar102._16_4_ * 0.0;
                auVar69._16_4_ = fVar87;
                fVar153 = auVar102._20_4_ * 0.0;
                auVar69._20_4_ = fVar153;
                fVar132 = auVar102._24_4_ * 0.0;
                auVar69._24_4_ = fVar132;
                auVar69._28_4_ = auVar102._28_4_;
                fVar163 = auVar96._0_4_ * fVar163;
                fVar139 = auVar96._4_4_ * fVar139;
                auVar70._4_4_ = fVar139;
                auVar70._0_4_ = fVar163;
                fVar162 = auVar96._8_4_ * fVar162;
                auVar70._8_4_ = fVar162;
                fVar168 = auVar96._12_4_ * fVar168;
                auVar70._12_4_ = fVar168;
                fVar133 = auVar96._16_4_ * 0.0;
                auVar70._16_4_ = fVar133;
                fVar134 = auVar96._20_4_ * 0.0;
                auVar70._20_4_ = fVar134;
                fVar135 = auVar96._24_4_ * 0.0;
                auVar70._24_4_ = fVar135;
                auVar70._28_4_ = auVar96._28_4_;
                auVar176._8_4_ = 0x3f800000;
                auVar176._0_8_ = &DAT_3f8000003f800000;
                auVar176._12_4_ = 0x3f800000;
                auVar176._16_4_ = 0x3f800000;
                auVar176._20_4_ = 0x3f800000;
                auVar176._24_4_ = 0x3f800000;
                auVar176._28_4_ = 0x3f800000;
                auVar98 = vsubps_avx(auVar176,auVar69);
                local_8a0._0_4_ =
                     (uint)(bVar79 & 1) * (int)fVar169 | (uint)!(bool)(bVar79 & 1) * auVar98._0_4_;
                bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
                local_8a0._4_4_ = (uint)bVar17 * (int)fVar170 | (uint)!bVar17 * auVar98._4_4_;
                bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
                local_8a0._8_4_ = (uint)bVar17 * (int)fVar154 | (uint)!bVar17 * auVar98._8_4_;
                bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
                local_8a0._12_4_ = (uint)bVar17 * (int)fVar161 | (uint)!bVar17 * auVar98._12_4_;
                bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
                local_8a0._16_4_ = (uint)bVar17 * (int)fVar87 | (uint)!bVar17 * auVar98._16_4_;
                bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
                local_8a0._20_4_ = (uint)bVar17 * (int)fVar153 | (uint)!bVar17 * auVar98._20_4_;
                bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                local_8a0._24_4_ = (uint)bVar17 * (int)fVar132 | (uint)!bVar17 * auVar98._24_4_;
                bVar17 = SUB81(uVar77 >> 7,0);
                local_8a0._28_4_ = (uint)bVar17 * auVar102._28_4_ | (uint)!bVar17 * auVar98._28_4_;
                auVar98 = vsubps_avx(auVar176,auVar70);
                local_580._0_4_ =
                     (uint)(bVar79 & 1) * (int)fVar163 | (uint)!(bool)(bVar79 & 1) * auVar98._0_4_;
                bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
                local_580._4_4_ = (uint)bVar17 * (int)fVar139 | (uint)!bVar17 * auVar98._4_4_;
                bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
                local_580._8_4_ = (uint)bVar17 * (int)fVar162 | (uint)!bVar17 * auVar98._8_4_;
                bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
                local_580._12_4_ = (uint)bVar17 * (int)fVar168 | (uint)!bVar17 * auVar98._12_4_;
                bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
                local_580._16_4_ = (uint)bVar17 * (int)fVar133 | (uint)!bVar17 * auVar98._16_4_;
                bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
                local_580._20_4_ = (uint)bVar17 * (int)fVar134 | (uint)!bVar17 * auVar98._20_4_;
                bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                local_580._24_4_ = (uint)bVar17 * (int)fVar135 | (uint)!bVar17 * auVar98._24_4_;
                bVar17 = SUB81(uVar77 >> 7,0);
                local_580._28_4_ = (uint)bVar17 * auVar96._28_4_ | (uint)!bVar17 * auVar98._28_4_;
                local_8c0 = auVar97;
              }
            }
            auVar204 = ZEXT3264(local_920);
            if (local_630 != 0) {
              auVar98 = vsubps_avx(ZEXT1632(auVar89),auVar104);
              auVar88 = vfmadd213ps_fma(auVar98,local_8a0,auVar104);
              uVar140 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar32._4_4_ = uVar140;
              auVar32._0_4_ = uVar140;
              auVar32._8_4_ = uVar140;
              auVar32._12_4_ = uVar140;
              auVar32._16_4_ = uVar140;
              auVar32._20_4_ = uVar140;
              auVar32._24_4_ = uVar140;
              auVar32._28_4_ = uVar140;
              auVar98 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                           CONCAT48(auVar88._8_4_ + auVar88._8_4_,
                                                                    CONCAT44(auVar88._4_4_ +
                                                                             auVar88._4_4_,
                                                                             auVar88._0_4_ +
                                                                             auVar88._0_4_)))),
                                        auVar32);
              uVar141 = vcmpps_avx512vl(local_8c0,auVar98,6);
              local_630 = local_630 & (byte)uVar141;
              if (local_630 != 0) {
                auVar146._8_4_ = 0xbf800000;
                auVar146._0_8_ = 0xbf800000bf800000;
                auVar146._12_4_ = 0xbf800000;
                auVar146._16_4_ = 0xbf800000;
                auVar146._20_4_ = 0xbf800000;
                auVar146._24_4_ = 0xbf800000;
                auVar146._28_4_ = 0xbf800000;
                auVar33._8_4_ = 0x40000000;
                auVar33._0_8_ = 0x4000000040000000;
                auVar33._12_4_ = 0x40000000;
                auVar33._16_4_ = 0x40000000;
                auVar33._20_4_ = 0x40000000;
                auVar33._24_4_ = 0x40000000;
                auVar33._28_4_ = 0x40000000;
                local_6c0 = vfmadd132ps_avx512vl(local_580,auVar146,auVar33);
                local_580 = local_6c0;
                auVar98 = local_580;
                local_680 = (undefined4)lVar86;
                local_670 = local_970._0_8_;
                uStack_668 = local_970._8_8_;
                local_660 = local_750._0_8_;
                uStack_658 = local_750._8_8_;
                local_650 = local_760._0_8_;
                uStack_648 = local_760._8_8_;
                local_640 = local_770._0_8_;
                uStack_638 = local_770._8_8_;
                pGVar13 = (context->scene->geometries).items[uVar85].ptr;
                if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                  bVar79 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar79 = 1, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_420 = vmovdqa64_avx512vl(auVar195._0_32_);
                  auVar88 = vcvtsi2ss_avx512f(auVar196._0_16_,local_680);
                  fVar163 = auVar88._0_4_;
                  local_620[0] = (fVar163 + local_8a0._0_4_ + 0.0) * (float)local_720;
                  local_620[1] = (fVar163 + local_8a0._4_4_ + 1.0) * local_720._4_4_;
                  local_620[2] = (fVar163 + local_8a0._8_4_ + 2.0) * fStack_718;
                  local_620[3] = (fVar163 + local_8a0._12_4_ + 3.0) * fStack_714;
                  fStack_610 = (fVar163 + local_8a0._16_4_ + 4.0) * fStack_710;
                  fStack_60c = (fVar163 + local_8a0._20_4_ + 5.0) * fStack_70c;
                  fStack_608 = (fVar163 + local_8a0._24_4_ + 6.0) * fStack_708;
                  fStack_604 = fVar163 + local_8a0._28_4_ + 7.0;
                  local_580._0_8_ = local_6c0._0_8_;
                  local_580._8_8_ = local_6c0._8_8_;
                  local_580._16_8_ = local_6c0._16_8_;
                  local_580._24_8_ = local_6c0._24_8_;
                  local_600 = local_580._0_8_;
                  uStack_5f8 = local_580._8_8_;
                  uStack_5f0 = local_580._16_8_;
                  uStack_5e8 = local_580._24_8_;
                  local_5e0 = local_8c0;
                  local_8e0 = local_750._0_8_;
                  uStack_8d8 = local_750._8_8_;
                  uVar77 = 0;
                  uVar81 = (ulong)local_630;
                  for (uVar83 = uVar81; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000
                      ) {
                    uVar77 = uVar77 + 1;
                  }
                  local_8f0 = local_760._0_4_;
                  fStack_8ec = local_760._4_4_;
                  fStack_8e8 = local_760._8_4_;
                  fStack_8e4 = local_760._12_4_;
                  _local_990 = local_770;
                  local_540._0_4_ = 1;
                  local_6e0 = local_8a0;
                  local_6a0 = local_8c0;
                  local_67c = iVar12;
                  local_580 = auVar98;
                  do {
                    local_980 = *(undefined4 *)(ray + k * 4 + 0x200);
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_620[uVar77]));
                    local_1c0 = vbroadcastss_avx512f
                                          (ZEXT416(*(uint *)((long)&local_600 + uVar77 * 4)));
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5e0 + uVar77 * 4);
                    local_9c0.context = context->user;
                    fVar139 = local_200._0_4_;
                    fVar163 = 1.0 - fVar139;
                    auVar6 = vfnmadd231ss_fma(ZEXT416((uint)(fVar139 * (fVar163 + fVar163))),
                                              ZEXT416((uint)fVar163),ZEXT416((uint)fVar163));
                    auVar90 = local_200._0_16_;
                    auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar90,
                                              ZEXT416(0xc0a00000));
                    auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139 * 3.0)),
                                              ZEXT416((uint)(fVar139 + fVar139)),auVar88);
                    auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar90,
                                              ZEXT416(0x40000000));
                    auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar163 * fVar163 * -3.0)),
                                              ZEXT416((uint)(fVar163 + fVar163)),auVar88);
                    auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139)),auVar90,
                                              ZEXT416((uint)(fVar163 * -2.0)));
                    fVar163 = auVar6._0_4_ * 0.5;
                    fVar139 = auVar89._0_4_ * 0.5;
                    fVar162 = auVar88._0_4_ * 0.5;
                    fVar168 = auVar90._0_4_ * 0.5;
                    auVar157._0_4_ = fVar168 * (float)local_990._0_4_;
                    auVar157._4_4_ = fVar168 * (float)local_990._4_4_;
                    auVar157._8_4_ = fVar168 * fStack_988;
                    auVar157._12_4_ = fVar168 * fStack_984;
                    auVar172._4_4_ = fVar162;
                    auVar172._0_4_ = fVar162;
                    auVar172._8_4_ = fVar162;
                    auVar172._12_4_ = fVar162;
                    auVar72._4_4_ = fStack_8ec;
                    auVar72._0_4_ = local_8f0;
                    auVar72._8_4_ = fStack_8e8;
                    auVar72._12_4_ = fStack_8e4;
                    auVar88 = vfmadd132ps_fma(auVar172,auVar157,auVar72);
                    auVar158._4_4_ = fVar139;
                    auVar158._0_4_ = fVar139;
                    auVar158._8_4_ = fVar139;
                    auVar158._12_4_ = fVar139;
                    auVar74._8_8_ = uStack_8d8;
                    auVar74._0_8_ = local_8e0;
                    auVar88 = vfmadd132ps_fma(auVar158,auVar88,auVar74);
                    auVar143._4_4_ = fVar163;
                    auVar143._0_4_ = fVar163;
                    auVar143._8_4_ = fVar163;
                    auVar143._12_4_ = fVar163;
                    auVar88 = vfmadd132ps_fma(auVar143,auVar88,local_970);
                    auVar147 = vbroadcastss_avx512f(auVar88);
                    auVar203 = vbroadcastss_avx512f(ZEXT416(1));
                    local_280 = vpermps_avx512f(auVar203,ZEXT1664(auVar88));
                    auVar203 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar203,ZEXT1664(auVar88));
                    local_2c0[0] = (RTCHitN)auVar147[0];
                    local_2c0[1] = (RTCHitN)auVar147[1];
                    local_2c0[2] = (RTCHitN)auVar147[2];
                    local_2c0[3] = (RTCHitN)auVar147[3];
                    local_2c0[4] = (RTCHitN)auVar147[4];
                    local_2c0[5] = (RTCHitN)auVar147[5];
                    local_2c0[6] = (RTCHitN)auVar147[6];
                    local_2c0[7] = (RTCHitN)auVar147[7];
                    local_2c0[8] = (RTCHitN)auVar147[8];
                    local_2c0[9] = (RTCHitN)auVar147[9];
                    local_2c0[10] = (RTCHitN)auVar147[10];
                    local_2c0[0xb] = (RTCHitN)auVar147[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar147[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar147[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar147[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar147[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar147[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar147[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar147[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar147[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar147[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar147[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar147[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar147[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar147[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar147[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar147[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar147[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar147[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar147[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar147[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar147[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar147[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar147[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar147[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar147[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar147[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar147[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar147[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar147[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar147[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar147[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar147[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar147[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar147[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar147[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar147[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar147[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar147[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar147[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar147[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar147[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar147[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar147[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar147[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar147[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar147[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar147[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar147[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar147[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar147[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar147[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar147[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar147[0x3f];
                    local_180 = local_480._0_8_;
                    uStack_178 = local_480._8_8_;
                    uStack_170 = local_480._16_8_;
                    uStack_168 = local_480._24_8_;
                    uStack_160 = local_480._32_8_;
                    uStack_158 = local_480._40_8_;
                    uStack_150 = local_480._48_8_;
                    uStack_148 = local_480._56_8_;
                    auVar147 = vmovdqa64_avx512f(local_4c0);
                    local_140 = vmovdqa64_avx512f(auVar147);
                    vpcmpeqd_avx2(auVar147._0_32_,auVar147._0_32_);
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_9c0.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_9c0.context)->instPrimID[0]));
                    local_5c0 = local_300;
                    local_9c0.valid = (int *)local_5c0;
                    local_9c0.geometryUserPtr = pGVar13->userPtr;
                    local_9c0.hit = local_2c0;
                    local_9c0.N = 0x10;
                    pRVar78 = (RayK<16> *)pGVar13->occlusionFilterN;
                    local_500._0_8_ = uVar77;
                    uVar83 = uVar77;
                    local_9c0.ray = (RTCRayN *)ray;
                    if (pRVar78 != (RayK<16> *)0x0) {
                      pRVar78 = (RayK<16> *)(*(code *)pRVar78)(&local_9c0);
                      uVar83 = local_500._0_8_;
                    }
                    auVar147 = vmovdqa64_avx512f(local_5c0);
                    uVar141 = vptestmd_avx512f(auVar147,auVar147);
                    if ((short)uVar141 != 0) {
                      p_Var16 = context->args->filter;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var16)(&local_9c0);
                        uVar83 = local_500._0_8_;
                      }
                      auVar88 = auVar201._0_16_;
                      auVar147 = vmovdqa64_avx512f(local_5c0);
                      uVar77 = vptestmd_avx512f(auVar147,auVar147);
                      auVar147 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar17 = (bool)((byte)uVar77 & 1);
                      auVar203._0_4_ =
                           (uint)bVar17 * auVar147._0_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x200);
                      bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
                      auVar203._4_4_ =
                           (uint)bVar17 * auVar147._4_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x204);
                      bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
                      auVar203._8_4_ =
                           (uint)bVar17 * auVar147._8_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x208);
                      bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
                      auVar203._12_4_ =
                           (uint)bVar17 * auVar147._12_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x20c);
                      bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
                      auVar203._16_4_ =
                           (uint)bVar17 * auVar147._16_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x210);
                      bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
                      auVar203._20_4_ =
                           (uint)bVar17 * auVar147._20_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x214);
                      bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                      auVar203._24_4_ =
                           (uint)bVar17 * auVar147._24_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x218);
                      bVar17 = (bool)((byte)(uVar77 >> 7) & 1);
                      auVar203._28_4_ =
                           (uint)bVar17 * auVar147._28_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x21c);
                      bVar17 = (bool)((byte)(uVar77 >> 8) & 1);
                      auVar203._32_4_ =
                           (uint)bVar17 * auVar147._32_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x220);
                      bVar17 = (bool)((byte)(uVar77 >> 9) & 1);
                      auVar203._36_4_ =
                           (uint)bVar17 * auVar147._36_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x224);
                      bVar17 = (bool)((byte)(uVar77 >> 10) & 1);
                      auVar203._40_4_ =
                           (uint)bVar17 * auVar147._40_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x228);
                      bVar17 = (bool)((byte)(uVar77 >> 0xb) & 1);
                      auVar203._44_4_ =
                           (uint)bVar17 * auVar147._44_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x22c);
                      bVar17 = (bool)((byte)(uVar77 >> 0xc) & 1);
                      auVar203._48_4_ =
                           (uint)bVar17 * auVar147._48_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x230);
                      bVar17 = (bool)((byte)(uVar77 >> 0xd) & 1);
                      auVar203._52_4_ =
                           (uint)bVar17 * auVar147._52_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x234);
                      bVar17 = (bool)((byte)(uVar77 >> 0xe) & 1);
                      auVar203._56_4_ =
                           (uint)bVar17 * auVar147._56_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x238);
                      bVar17 = SUB81(uVar77 >> 0xf,0);
                      auVar203._60_4_ =
                           (uint)bVar17 * auVar147._60_4_ |
                           (uint)!bVar17 * *(int *)(local_9c0.ray + 0x23c);
                      *(undefined1 (*) [64])(local_9c0.ray + 0x200) = auVar203;
                      pRVar78 = (RayK<16> *)local_9c0.ray;
                      if ((short)uVar77 != 0) break;
                    }
                    auVar88 = auVar201._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_980;
                    uVar77 = 0;
                    uVar81 = uVar81 ^ 1L << (uVar83 & 0x3f);
                    for (uVar83 = uVar81; (uVar83 & 1) == 0;
                        uVar83 = uVar83 >> 1 | 0x8000000000000000) {
                      uVar77 = uVar77 + 1;
                    }
                    local_540._0_4_ = (int)CONCAT71((int7)((ulong)pRVar78 >> 8),uVar81 != 0);
                  } while (uVar81 != 0);
                  bVar79 = local_540[0] & 1;
                  auVar88 = vxorps_avx512vl(auVar88,auVar88);
                  auVar201 = ZEXT1664(auVar88);
                  auVar197 = ZEXT3264(local_7a0);
                  auVar198 = ZEXT3264(local_740);
                  auVar199 = ZEXT3264(local_7c0);
                  auVar190 = ZEXT3264(local_7e0);
                  auVar204 = ZEXT3264(local_920);
                  auVar202 = ZEXT3264(local_820);
                  auVar147 = ZEXT3264(local_840);
                  auVar203 = ZEXT3264(local_860);
                  auVar98 = vmovdqa64_avx512vl(local_420);
                  auVar195 = ZEXT3264(auVar98);
                }
                bVar84 = (bool)(bVar84 | bVar79);
              }
            }
          }
          lVar86 = lVar86 + 8;
          auVar196 = auVar190;
        } while ((int)lVar86 < iVar12);
      }
      if (bVar84 != false) {
        return local_9f9;
      }
      uVar140 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar29._4_4_ = uVar140;
      auVar29._0_4_ = uVar140;
      auVar29._8_4_ = uVar140;
      auVar29._12_4_ = uVar140;
      auVar29._16_4_ = uVar140;
      auVar29._20_4_ = uVar140;
      auVar29._24_4_ = uVar140;
      auVar29._28_4_ = uVar140;
      uVar141 = vcmpps_avx512vl(local_320,auVar29,2);
      uVar85 = (uint)uVar80 & (uint)uVar80 + 0xff & (uint)uVar141;
      uVar80 = (ulong)uVar85;
      local_9f9 = uVar85 != 0;
    } while (local_9f9);
  }
  return local_9f9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }